

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O2

bool embree::avx512::CurveNiMBIntersectorK<4,4>::
     occluded_t<embree::avx512::RibbonCurve1IntersectorK<embree::BSplineCurveT,4,8>,embree::avx512::Occluded1KEpilogMU<8,4,true>>
               (Precalculations *pre,RayK<4> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  int iVar1;
  int iVar2;
  float *pfVar3;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar4;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar5;
  int iVar6;
  __int_type_conflict _Var7;
  long lVar8;
  RTCFilterFunctionN p_Var9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined8 uVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  RayQueryContext *pRVar52;
  byte bVar53;
  ulong uVar54;
  Geometry *geometry;
  long lVar55;
  long lVar56;
  bool bVar57;
  ulong uVar58;
  Geometry *pGVar59;
  ulong uVar60;
  long lVar61;
  byte bVar62;
  ulong uVar63;
  float fVar64;
  float fVar124;
  float fVar126;
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  float fVar65;
  float fVar125;
  float fVar127;
  float fVar128;
  float fVar129;
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar86 [16];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  float fVar130;
  float fVar131;
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined4 uVar132;
  undefined4 uVar133;
  vint4 bi_2;
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined8 uVar139;
  vint4 bi_1;
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [32];
  vint4 bi;
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  float fVar148;
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  vint4 ai;
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  float fVar161;
  float fVar162;
  float fVar164;
  vint4 ai_1;
  undefined1 auVar163 [16];
  vint4 ai_2;
  undefined1 auVar165 [32];
  float fVar166;
  uint uVar167;
  float fVar169;
  float fVar170;
  undefined1 auVar168 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [32];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [32];
  undefined1 auVar183 [32];
  undefined1 auVar184 [64];
  undefined1 auVar185 [64];
  undefined1 auVar186 [64];
  undefined1 auVar187 [64];
  undefined1 auVar188 [64];
  undefined1 auVar189 [64];
  undefined1 auVar190 [64];
  undefined1 auVar191 [64];
  undefined1 auVar192 [64];
  undefined1 auVar193 [64];
  undefined1 auVar194 [64];
  RTCFilterFunctionNArguments args;
  undefined1 local_5c0 [16];
  Precalculations *local_5b0;
  ulong local_5a8;
  Geometry *local_5a0;
  RayQueryContext *local_598;
  RTCFilterFunctionNArguments local_590;
  undefined1 local_560 [32];
  undefined1 local_540 [32];
  undefined1 local_510 [16];
  undefined1 local_500 [16];
  undefined1 local_4f0 [16];
  undefined1 local_4e0 [16];
  undefined1 local_4d0 [16];
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [32];
  undefined1 local_480 [32];
  undefined1 local_460 [32];
  LinearSpace3fa *local_430;
  Primitive *local_428;
  undefined1 local_420 [32];
  undefined1 local_400 [32];
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  undefined1 local_370 [16];
  undefined1 local_360 [16];
  undefined1 local_350 [8];
  float fStack_348;
  float fStack_344;
  undefined8 local_340;
  float fStack_338;
  float fStack_334;
  float fStack_330;
  float fStack_32c;
  float fStack_328;
  float fStack_324;
  uint local_320;
  uint uStack_31c;
  uint uStack_318;
  uint uStack_314;
  uint uStack_310;
  uint uStack_30c;
  uint uStack_308;
  uint uStack_304;
  RTCHitN local_300 [16];
  undefined1 local_2f0 [16];
  undefined1 local_2e0 [16];
  undefined1 local_2d0 [16];
  undefined4 local_2c0;
  undefined4 uStack_2bc;
  undefined4 uStack_2b8;
  undefined4 uStack_2b4;
  undefined8 local_2b0;
  undefined8 uStack_2a8;
  undefined1 local_2a0 [16];
  uint local_290;
  uint uStack_28c;
  uint uStack_288;
  uint uStack_284;
  uint uStack_280;
  uint uStack_27c;
  uint uStack_278;
  uint uStack_274;
  undefined1 local_270 [16];
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined4 local_200;
  int local_1fc;
  undefined8 local_1f0;
  undefined8 uStack_1e8;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 local_1d0;
  undefined8 uStack_1c8;
  float local_1a0 [4];
  float fStack_190;
  float fStack_18c;
  float fStack_188;
  float fStack_184;
  undefined1 local_180 [32];
  undefined1 local_160 [32];
  undefined1 local_140 [32];
  undefined1 local_120 [32];
  undefined1 local_100 [32];
  undefined1 local_e0 [8];
  float fStack_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float fStack_c8;
  undefined4 uStack_c4;
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  
  uVar63 = (ulong)(byte)prim[1];
  auVar16 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar63 * 4 + 6)));
  auVar75 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar63 * 5 + 6)));
  auVar71 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar63 * 6 + 6)));
  auVar72 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar63 * 0xf + 6)));
  lVar61 = uVar63 * 0x25;
  auVar73 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)prim[1] * 0x10 + 6)));
  auVar74 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar63 * 0x11 + 6)));
  auVar76 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar63 * 0x1a + 6)));
  auVar77 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar63 * 0x1b + 6)));
  auVar78 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar63 * 0x1c + 6)));
  uVar132 = *(undefined4 *)(prim + lVar61 + 0x12);
  auVar181._4_4_ = uVar132;
  auVar181._0_4_ = uVar132;
  auVar181._8_4_ = uVar132;
  auVar181._12_4_ = uVar132;
  auVar79 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x10);
  auVar79 = vinsertps_avx(auVar79,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar66 = vsubps_avx512vl(auVar79,*(undefined1 (*) [16])(prim + lVar61 + 6));
  fVar148 = (*(float *)(ray + k * 4 + 0x70) - *(float *)(prim + lVar61 + 0x16)) *
            *(float *)(prim + lVar61 + 0x1a);
  auVar79._8_8_ = 0;
  auVar79._0_8_ = *(ulong *)(prim + uVar63 * 7 + 6);
  auVar85 = vpmovsxwd_avx(auVar79);
  auVar84._8_8_ = 0;
  auVar84._0_8_ = *(ulong *)(prim + uVar63 * 0xb + 6);
  auVar17 = vpmovsxwd_avx(auVar84);
  auVar81._8_8_ = 0;
  auVar81._0_8_ = *(ulong *)(prim + uVar63 * 9 + 6);
  auVar18 = vpmovsxwd_avx(auVar81);
  auVar80._8_8_ = 0;
  auVar80._0_8_ = *(ulong *)(prim + uVar63 * 0xd + 6);
  auVar134 = vpmovsxwd_avx(auVar80);
  auVar67 = vpbroadcastd_avx512vl();
  auVar79 = vinsertps_avx512f(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                              ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar79 = vinsertps_avx512f(auVar79,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  auVar66 = vmulps_avx512vl(auVar181,auVar66);
  auVar68 = vmulps_avx512vl(auVar181,auVar79);
  auVar69 = vcvtdq2ps_avx512vl(auVar16);
  auVar70 = vcvtdq2ps_avx512vl(auVar75);
  auVar71 = vcvtdq2ps_avx512vl(auVar71);
  auVar72 = vcvtdq2ps_avx512vl(auVar72);
  auVar73 = vcvtdq2ps_avx512vl(auVar73);
  auVar79 = vcvtdq2ps_avx(auVar74);
  auVar84 = vcvtdq2ps_avx(auVar76);
  auVar81 = vcvtdq2ps_avx(auVar77);
  auVar80 = vcvtdq2ps_avx(auVar78);
  uVar132 = auVar68._0_4_;
  auVar173._4_4_ = uVar132;
  auVar173._0_4_ = uVar132;
  auVar173._8_4_ = uVar132;
  auVar173._12_4_ = uVar132;
  auVar16 = vshufps_avx(auVar68,auVar68,0x55);
  auVar75 = vshufps_avx(auVar68,auVar68,0xaa);
  auVar74 = vmulps_avx512vl(auVar75,auVar71);
  auVar140._0_4_ = auVar75._0_4_ * auVar79._0_4_;
  auVar140._4_4_ = auVar75._4_4_ * auVar79._4_4_;
  auVar140._8_4_ = auVar75._8_4_ * auVar79._8_4_;
  auVar140._12_4_ = auVar75._12_4_ * auVar79._12_4_;
  auVar68._0_4_ = auVar80._0_4_ * auVar75._0_4_;
  auVar68._4_4_ = auVar80._4_4_ * auVar75._4_4_;
  auVar68._8_4_ = auVar80._8_4_ * auVar75._8_4_;
  auVar68._12_4_ = auVar80._12_4_ * auVar75._12_4_;
  auVar75 = vfmadd231ps_avx512vl(auVar74,auVar16,auVar70);
  auVar74 = vfmadd231ps_avx512vl(auVar140,auVar16,auVar73);
  auVar16 = vfmadd231ps_fma(auVar68,auVar81,auVar16);
  auVar75 = vfmadd231ps_avx512vl(auVar75,auVar173,auVar69);
  auVar74 = vfmadd231ps_avx512vl(auVar74,auVar173,auVar72);
  auVar16 = vfmadd231ps_fma(auVar16,auVar84,auVar173);
  auVar76 = vbroadcastss_avx512vl(auVar66);
  auVar77 = vshufps_avx512vl(auVar66,auVar66,0x55);
  auVar78 = vshufps_avx512vl(auVar66,auVar66,0xaa);
  auVar71 = vmulps_avx512vl(auVar78,auVar71);
  auVar79 = vmulps_avx512vl(auVar78,auVar79);
  auVar80 = vmulps_avx512vl(auVar78,auVar80);
  auVar71 = vfmadd231ps_avx512vl(auVar71,auVar77,auVar70);
  auVar79 = vfmadd231ps_avx512vl(auVar79,auVar77,auVar73);
  auVar81 = vfmadd231ps_avx512vl(auVar80,auVar77,auVar81);
  auVar69 = vfmadd231ps_avx512vl(auVar71,auVar76,auVar69);
  auVar70 = vfmadd231ps_avx512vl(auVar79,auVar76,auVar72);
  auVar68 = vfmadd231ps_fma(auVar81,auVar76,auVar84);
  auVar180._8_4_ = 0x7fffffff;
  auVar180._0_8_ = 0x7fffffff7fffffff;
  auVar180._12_4_ = 0x7fffffff;
  auVar79 = vandps_avx(auVar180,auVar75);
  auVar177._8_4_ = 0x219392ef;
  auVar177._0_8_ = 0x219392ef219392ef;
  auVar177._12_4_ = 0x219392ef;
  uVar60 = vcmpps_avx512vl(auVar79,auVar177,1);
  bVar57 = (bool)((byte)uVar60 & 1);
  auVar66._0_4_ = (uint)bVar57 * 0x219392ef | (uint)!bVar57 * auVar75._0_4_;
  bVar57 = (bool)((byte)(uVar60 >> 1) & 1);
  auVar66._4_4_ = (uint)bVar57 * 0x219392ef | (uint)!bVar57 * auVar75._4_4_;
  bVar57 = (bool)((byte)(uVar60 >> 2) & 1);
  auVar66._8_4_ = (uint)bVar57 * 0x219392ef | (uint)!bVar57 * auVar75._8_4_;
  bVar57 = (bool)((byte)(uVar60 >> 3) & 1);
  auVar66._12_4_ = (uint)bVar57 * 0x219392ef | (uint)!bVar57 * auVar75._12_4_;
  auVar79 = vandps_avx(auVar180,auVar74);
  uVar60 = vcmpps_avx512vl(auVar79,auVar177,1);
  bVar57 = (bool)((byte)uVar60 & 1);
  auVar82._0_4_ = (uint)bVar57 * 0x219392ef | (uint)!bVar57 * auVar74._0_4_;
  bVar57 = (bool)((byte)(uVar60 >> 1) & 1);
  auVar82._4_4_ = (uint)bVar57 * 0x219392ef | (uint)!bVar57 * auVar74._4_4_;
  bVar57 = (bool)((byte)(uVar60 >> 2) & 1);
  auVar82._8_4_ = (uint)bVar57 * 0x219392ef | (uint)!bVar57 * auVar74._8_4_;
  bVar57 = (bool)((byte)(uVar60 >> 3) & 1);
  auVar82._12_4_ = (uint)bVar57 * 0x219392ef | (uint)!bVar57 * auVar74._12_4_;
  auVar79 = vandps_avx(auVar180,auVar16);
  uVar60 = vcmpps_avx512vl(auVar79,auVar177,1);
  bVar57 = (bool)((byte)uVar60 & 1);
  auVar83._0_4_ = (uint)bVar57 * 0x219392ef | (uint)!bVar57 * auVar16._0_4_;
  bVar57 = (bool)((byte)(uVar60 >> 1) & 1);
  auVar83._4_4_ = (uint)bVar57 * 0x219392ef | (uint)!bVar57 * auVar16._4_4_;
  bVar57 = (bool)((byte)(uVar60 >> 2) & 1);
  auVar83._8_4_ = (uint)bVar57 * 0x219392ef | (uint)!bVar57 * auVar16._8_4_;
  bVar57 = (bool)((byte)(uVar60 >> 3) & 1);
  auVar83._12_4_ = (uint)bVar57 * 0x219392ef | (uint)!bVar57 * auVar16._12_4_;
  auVar84 = vrcp14ps_avx512vl(auVar66);
  auVar178._8_4_ = 0x3f800000;
  auVar178._0_8_ = 0x3f8000003f800000;
  auVar178._12_4_ = 0x3f800000;
  auVar79 = vfnmadd213ps_fma(auVar66,auVar84,auVar178);
  auVar80 = vfmadd132ps_fma(auVar79,auVar84,auVar84);
  auVar84 = vrcp14ps_avx512vl(auVar82);
  auVar79 = vfnmadd213ps_fma(auVar82,auVar84,auVar178);
  auVar78 = vfmadd132ps_fma(auVar79,auVar84,auVar84);
  auVar84 = vrcp14ps_avx512vl(auVar83);
  auVar79 = vfnmadd213ps_fma(auVar83,auVar84,auVar178);
  auVar66 = vfmadd132ps_fma(auVar79,auVar84,auVar84);
  auVar151._4_4_ = fVar148;
  auVar151._0_4_ = fVar148;
  auVar151._8_4_ = fVar148;
  auVar151._12_4_ = fVar148;
  auVar79 = vcvtdq2ps_avx(auVar85);
  auVar84 = vcvtdq2ps_avx(auVar17);
  auVar84 = vsubps_avx(auVar84,auVar79);
  auVar85 = vfmadd213ps_fma(auVar84,auVar151,auVar79);
  auVar79 = vcvtdq2ps_avx(auVar18);
  auVar84 = vcvtdq2ps_avx(auVar134);
  auVar84 = vsubps_avx(auVar84,auVar79);
  auVar17 = vfmadd213ps_fma(auVar84,auVar151,auVar79);
  auVar16._8_8_ = 0;
  auVar16._0_8_ = *(ulong *)(prim + uVar63 * 0x12 + 6);
  auVar79 = vpmovsxwd_avx(auVar16);
  auVar79 = vcvtdq2ps_avx(auVar79);
  auVar75._8_8_ = 0;
  auVar75._0_8_ = *(ulong *)(prim + uVar63 * 0x16 + 6);
  auVar84 = vpmovsxwd_avx(auVar75);
  auVar84 = vcvtdq2ps_avx(auVar84);
  auVar84 = vsubps_avx(auVar84,auVar79);
  auVar16 = vfmadd213ps_fma(auVar84,auVar151,auVar79);
  auVar71._8_8_ = 0;
  auVar71._0_8_ = *(ulong *)(prim + uVar63 * 0x14 + 6);
  auVar79 = vpmovsxwd_avx(auVar71);
  auVar79 = vcvtdq2ps_avx(auVar79);
  auVar72._8_8_ = 0;
  auVar72._0_8_ = *(ulong *)(prim + uVar63 * 0x18 + 6);
  auVar84 = vpmovsxwd_avx(auVar72);
  auVar84 = vcvtdq2ps_avx(auVar84);
  auVar81 = vsubps_avx(auVar84,auVar79);
  auVar73._8_8_ = 0;
  auVar73._0_8_ = *(ulong *)(prim + uVar63 * 0x1d + 6);
  auVar84 = vpmovsxwd_avx(auVar73);
  auVar81 = vfmadd213ps_fma(auVar81,auVar151,auVar79);
  auVar79 = vcvtdq2ps_avx(auVar84);
  auVar74._8_8_ = 0;
  auVar74._0_8_ = *(ulong *)(prim + uVar63 * 0x21 + 6);
  auVar84 = vpmovsxwd_avx(auVar74);
  auVar84 = vcvtdq2ps_avx(auVar84);
  auVar84 = vsubps_avx(auVar84,auVar79);
  auVar75 = vfmadd213ps_fma(auVar84,auVar151,auVar79);
  auVar76._8_8_ = 0;
  auVar76._0_8_ = *(ulong *)(prim + uVar63 * 0x1f + 6);
  auVar79 = vpmovsxwd_avx(auVar76);
  auVar79 = vcvtdq2ps_avx(auVar79);
  auVar77._8_8_ = 0;
  auVar77._0_8_ = *(ulong *)(prim + uVar63 * 0x23 + 6);
  auVar84 = vpmovsxwd_avx(auVar77);
  auVar84 = vcvtdq2ps_avx(auVar84);
  auVar84 = vsubps_avx(auVar84,auVar79);
  auVar84 = vfmadd213ps_fma(auVar84,auVar151,auVar79);
  auVar79 = vsubps_avx(auVar85,auVar69);
  auVar152._0_4_ = auVar80._0_4_ * auVar79._0_4_;
  auVar152._4_4_ = auVar80._4_4_ * auVar79._4_4_;
  auVar152._8_4_ = auVar80._8_4_ * auVar79._8_4_;
  auVar152._12_4_ = auVar80._12_4_ * auVar79._12_4_;
  auVar79 = vsubps_avx(auVar17,auVar69);
  auVar144._0_4_ = auVar80._0_4_ * auVar79._0_4_;
  auVar144._4_4_ = auVar80._4_4_ * auVar79._4_4_;
  auVar144._8_4_ = auVar80._8_4_ * auVar79._8_4_;
  auVar144._12_4_ = auVar80._12_4_ * auVar79._12_4_;
  auVar79 = vsubps_avx(auVar16,auVar70);
  auVar163._0_4_ = auVar78._0_4_ * auVar79._0_4_;
  auVar163._4_4_ = auVar78._4_4_ * auVar79._4_4_;
  auVar163._8_4_ = auVar78._8_4_ * auVar79._8_4_;
  auVar163._12_4_ = auVar78._12_4_ * auVar79._12_4_;
  auVar79 = vsubps_avx(auVar81,auVar70);
  auVar69._0_4_ = auVar78._0_4_ * auVar79._0_4_;
  auVar69._4_4_ = auVar78._4_4_ * auVar79._4_4_;
  auVar69._8_4_ = auVar78._8_4_ * auVar79._8_4_;
  auVar69._12_4_ = auVar78._12_4_ * auVar79._12_4_;
  auVar79 = vsubps_avx(auVar75,auVar68);
  auVar70._0_4_ = auVar66._0_4_ * auVar79._0_4_;
  auVar70._4_4_ = auVar66._4_4_ * auVar79._4_4_;
  auVar70._8_4_ = auVar66._8_4_ * auVar79._8_4_;
  auVar70._12_4_ = auVar66._12_4_ * auVar79._12_4_;
  auVar79 = vsubps_avx(auVar84,auVar68);
  auVar134._0_4_ = auVar66._0_4_ * auVar79._0_4_;
  auVar134._4_4_ = auVar66._4_4_ * auVar79._4_4_;
  auVar134._8_4_ = auVar66._8_4_ * auVar79._8_4_;
  auVar134._12_4_ = auVar66._12_4_ * auVar79._12_4_;
  auVar79 = vpminsd_avx(auVar152,auVar144);
  auVar84 = vpminsd_avx(auVar163,auVar69);
  auVar79 = vmaxps_avx(auVar79,auVar84);
  auVar84 = vpminsd_avx(auVar70,auVar134);
  uVar132 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar78._4_4_ = uVar132;
  auVar78._0_4_ = uVar132;
  auVar78._8_4_ = uVar132;
  auVar78._12_4_ = uVar132;
  auVar84 = vmaxps_avx512vl(auVar84,auVar78);
  auVar79 = vmaxps_avx(auVar79,auVar84);
  auVar85._8_4_ = 0x3f7ffffa;
  auVar85._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar85._12_4_ = 0x3f7ffffa;
  local_270 = vmulps_avx512vl(auVar79,auVar85);
  auVar79 = vpmaxsd_avx(auVar152,auVar144);
  auVar84 = vpmaxsd_avx(auVar163,auVar69);
  auVar79 = vminps_avx(auVar79,auVar84);
  auVar84 = vpmaxsd_avx(auVar70,auVar134);
  uVar132 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar17._4_4_ = uVar132;
  auVar17._0_4_ = uVar132;
  auVar17._8_4_ = uVar132;
  auVar17._12_4_ = uVar132;
  auVar84 = vminps_avx512vl(auVar84,auVar17);
  auVar79 = vminps_avx(auVar79,auVar84);
  auVar18._8_4_ = 0x3f800003;
  auVar18._0_8_ = 0x3f8000033f800003;
  auVar18._12_4_ = 0x3f800003;
  auVar79 = vmulps_avx512vl(auVar79,auVar18);
  uVar139 = vcmpps_avx512vl(local_270,auVar79,2);
  uVar19 = vpcmpgtd_avx512vl(auVar67,_DAT_01f4ad30);
  uVar60 = (ulong)((byte)uVar139 & 0xf & (byte)uVar19);
  local_430 = pre->ray_space + k;
  local_370 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
  local_5b0 = pre;
  local_598 = context;
  local_428 = prim;
  for (; pRVar52 = local_598, uVar60 != 0;
      uVar60 = (ulong)((uint)uVar60 & (uint)uVar60 + 0xf & (uint)uVar139)) {
    lVar61 = 0;
    for (uVar63 = uVar60; (uVar63 & 1) == 0; uVar63 = uVar63 >> 1 | 0x8000000000000000) {
      lVar61 = lVar61 + 1;
    }
    local_5a8 = (ulong)*(uint *)(local_428 + 2);
    pGVar59 = (context->scene->geometries).items[local_5a8].ptr;
    uVar63 = (ulong)*(uint *)(*(long *)&pGVar59->field_0x58 +
                             (ulong)*(uint *)(local_428 + lVar61 * 4 + 6) *
                             pGVar59[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>
                             ._M_i);
    fVar148 = (pGVar59->time_range).lower;
    fVar148 = pGVar59->fnumTimeSegments *
              ((*(float *)(ray + k * 4 + 0x70) - fVar148) / ((pGVar59->time_range).upper - fVar148))
    ;
    auVar79 = vroundss_avx(ZEXT416((uint)fVar148),ZEXT416((uint)fVar148),9);
    auVar79 = vminss_avx(auVar79,ZEXT416((uint)(pGVar59->fnumTimeSegments + -1.0)));
    auVar79 = vmaxss_avx(ZEXT816(0) << 0x20,auVar79);
    fVar148 = fVar148 - auVar79._0_4_;
    _Var7 = pGVar59[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
    lVar56 = (long)(int)auVar79._0_4_ * 0x38;
    lVar61 = *(long *)(_Var7 + 0x10 + lVar56);
    lVar55 = *(long *)(_Var7 + 0x38 + lVar56);
    lVar8 = *(long *)(_Var7 + 0x48 + lVar56);
    auVar141._4_4_ = fVar148;
    auVar141._0_4_ = fVar148;
    auVar141._8_4_ = fVar148;
    auVar141._12_4_ = fVar148;
    pfVar3 = (float *)(lVar55 + uVar63 * lVar8);
    auVar175._0_4_ = fVar148 * *pfVar3;
    auVar175._4_4_ = fVar148 * pfVar3[1];
    auVar175._8_4_ = fVar148 * pfVar3[2];
    auVar175._12_4_ = fVar148 * pfVar3[3];
    pfVar3 = (float *)(lVar55 + (uVar63 + 1) * lVar8);
    auVar176._0_4_ = fVar148 * *pfVar3;
    auVar176._4_4_ = fVar148 * pfVar3[1];
    auVar176._8_4_ = fVar148 * pfVar3[2];
    auVar176._12_4_ = fVar148 * pfVar3[3];
    auVar79 = vmulps_avx512vl(auVar141,*(undefined1 (*) [16])(lVar55 + (uVar63 + 2) * lVar8));
    auVar84 = vmulps_avx512vl(auVar141,*(undefined1 (*) [16])(lVar55 + lVar8 * (uVar63 + 3)));
    lVar55 = *(long *)(_Var7 + lVar56);
    fVar148 = 1.0 - fVar148;
    auVar67._4_4_ = fVar148;
    auVar67._0_4_ = fVar148;
    auVar67._8_4_ = fVar148;
    auVar67._12_4_ = fVar148;
    local_4d0 = vfmadd231ps_fma(auVar175,auVar67,*(undefined1 (*) [16])(lVar55 + lVar61 * uVar63));
    local_4e0 = vfmadd231ps_fma(auVar176,auVar67,
                                *(undefined1 (*) [16])(lVar55 + lVar61 * (uVar63 + 1)));
    local_4f0 = vfmadd231ps_avx512vl
                          (auVar79,auVar67,*(undefined1 (*) [16])(lVar55 + lVar61 * (uVar63 + 2)));
    _local_350 = vfmadd231ps_avx512vl
                           (auVar84,auVar67,*(undefined1 (*) [16])(lVar55 + lVar61 * (uVar63 + 3)));
    iVar6 = (int)pGVar59[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
    auVar79 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                            0x1c);
    auVar79 = vinsertps_avx(auVar79,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
    auVar81 = vsubps_avx(local_4d0,auVar79);
    uVar132 = auVar81._0_4_;
    auVar145._4_4_ = uVar132;
    auVar145._0_4_ = uVar132;
    auVar145._8_4_ = uVar132;
    auVar145._12_4_ = uVar132;
    auVar84 = vshufps_avx(auVar81,auVar81,0x55);
    auVar81 = vshufps_avx(auVar81,auVar81,0xaa);
    aVar4 = (local_430->vx).field_0;
    aVar5 = (local_430->vy).field_0;
    fVar148 = (local_430->vz).field_0.m128[0];
    fVar166 = *(float *)((long)&(local_430->vz).field_0 + 4);
    fVar169 = *(float *)((long)&(local_430->vz).field_0 + 8);
    fVar170 = *(float *)((long)&(local_430->vz).field_0 + 0xc);
    auVar168._0_4_ = fVar148 * auVar81._0_4_;
    auVar168._4_4_ = fVar166 * auVar81._4_4_;
    auVar168._8_4_ = fVar169 * auVar81._8_4_;
    auVar168._12_4_ = fVar170 * auVar81._12_4_;
    auVar84 = vfmadd231ps_fma(auVar168,(undefined1  [16])aVar5,auVar84);
    auVar80 = vfmadd231ps_fma(auVar84,(undefined1  [16])aVar4,auVar145);
    auVar81 = vsubps_avx(local_4e0,auVar79);
    uVar132 = auVar81._0_4_;
    auVar146._4_4_ = uVar132;
    auVar146._0_4_ = uVar132;
    auVar146._8_4_ = uVar132;
    auVar146._12_4_ = uVar132;
    auVar84 = vshufps_avx(auVar81,auVar81,0x55);
    auVar81 = vshufps_avx(auVar81,auVar81,0xaa);
    auVar171._0_4_ = fVar148 * auVar81._0_4_;
    auVar171._4_4_ = fVar166 * auVar81._4_4_;
    auVar171._8_4_ = fVar169 * auVar81._8_4_;
    auVar171._12_4_ = fVar170 * auVar81._12_4_;
    auVar84 = vfmadd231ps_fma(auVar171,(undefined1  [16])aVar5,auVar84);
    auVar16 = vfmadd231ps_fma(auVar84,(undefined1  [16])aVar4,auVar146);
    auVar81 = vsubps_avx512vl(local_4f0,auVar79);
    uVar132 = auVar81._0_4_;
    auVar147._4_4_ = uVar132;
    auVar147._0_4_ = uVar132;
    auVar147._8_4_ = uVar132;
    auVar147._12_4_ = uVar132;
    auVar84 = vshufps_avx(auVar81,auVar81,0x55);
    auVar81 = vshufps_avx(auVar81,auVar81,0xaa);
    auVar174._0_4_ = fVar148 * auVar81._0_4_;
    auVar174._4_4_ = fVar166 * auVar81._4_4_;
    auVar174._8_4_ = fVar169 * auVar81._8_4_;
    auVar174._12_4_ = fVar170 * auVar81._12_4_;
    auVar84 = vfmadd231ps_fma(auVar174,(undefined1  [16])aVar5,auVar84);
    auVar81 = vfmadd231ps_fma(auVar84,(undefined1  [16])aVar4,auVar147);
    auVar84 = vsubps_avx512vl(_local_350,auVar79);
    uVar132 = auVar84._0_4_;
    auVar142._4_4_ = uVar132;
    auVar142._0_4_ = uVar132;
    auVar142._8_4_ = uVar132;
    auVar142._12_4_ = uVar132;
    auVar79 = vshufps_avx(auVar84,auVar84,0x55);
    auVar84 = vshufps_avx(auVar84,auVar84,0xaa);
    auVar179._0_4_ = fVar148 * auVar84._0_4_;
    auVar179._4_4_ = fVar166 * auVar84._4_4_;
    auVar179._8_4_ = fVar169 * auVar84._8_4_;
    auVar179._12_4_ = fVar170 * auVar84._12_4_;
    auVar79 = vfmadd231ps_fma(auVar179,(undefined1  [16])aVar5,auVar79);
    auVar75 = vfmadd231ps_fma(auVar79,(undefined1  [16])aVar4,auVar142);
    lVar61 = (long)iVar6 * 0x44;
    auVar102 = *(undefined1 (*) [32])(bspline_basis0 + lVar61);
    uVar132 = auVar80._0_4_;
    local_3e0._4_4_ = uVar132;
    local_3e0._0_4_ = uVar132;
    local_3e0._8_4_ = uVar132;
    local_3e0._12_4_ = uVar132;
    local_3e0._16_4_ = uVar132;
    local_3e0._20_4_ = uVar132;
    local_3e0._24_4_ = uVar132;
    local_3e0._28_4_ = uVar132;
    auVar88._8_4_ = 1;
    auVar88._0_8_ = 0x100000001;
    auVar88._12_4_ = 1;
    auVar88._16_4_ = 1;
    auVar88._20_4_ = 1;
    auVar88._24_4_ = 1;
    auVar88._28_4_ = 1;
    local_3c0 = vpermps_avx2(auVar88,ZEXT1632(auVar80));
    auVar103 = *(undefined1 (*) [32])(bspline_basis0 + lVar61 + 0x484);
    uVar132 = auVar16._0_4_;
    local_540._4_4_ = uVar132;
    local_540._0_4_ = uVar132;
    local_540._8_4_ = uVar132;
    local_540._12_4_ = uVar132;
    local_540._16_4_ = uVar132;
    local_540._20_4_ = uVar132;
    local_540._24_4_ = uVar132;
    local_540._28_4_ = uVar132;
    local_560 = vpermps_avx512vl(auVar88,ZEXT1632(auVar16));
    auVar101 = *(undefined1 (*) [32])(bspline_basis0 + lVar61 + 0x908);
    local_480 = vbroadcastss_avx512vl(auVar81);
    local_400 = vpermps_avx512vl(auVar88,ZEXT1632(auVar81));
    auVar100 = *(undefined1 (*) [32])(bspline_basis0 + lVar61 + 0xd8c);
    local_4a0 = vbroadcastss_avx512vl(auVar75);
    auVar191 = ZEXT3264(local_4a0);
    local_4c0 = vpermps_avx512vl(auVar88,ZEXT1632(auVar75));
    auVar193 = ZEXT3264(local_4c0);
    auVar88 = vmulps_avx512vl(local_4a0,auVar100);
    auVar89 = vmulps_avx512vl(local_4c0,auVar100);
    auVar88 = vfmadd231ps_avx512vl(auVar88,auVar101,local_480);
    auVar89 = vfmadd231ps_avx512vl(auVar89,auVar101,local_400);
    auVar79 = vfmadd231ps_fma(auVar88,auVar103,local_540);
    auVar88 = vfmadd231ps_avx512vl(auVar89,auVar103,local_560);
    auVar90 = vfmadd231ps_avx512vl(ZEXT1632(auVar79),auVar102,local_3e0);
    auVar91 = vfmadd231ps_avx512vl(auVar88,auVar102,local_3c0);
    auVar88 = *(undefined1 (*) [32])(bspline_basis1 + lVar61);
    auVar89 = *(undefined1 (*) [32])(bspline_basis1 + lVar61 + 0x484);
    auVar99 = *(undefined1 (*) [32])(bspline_basis1 + lVar61 + 0x908);
    auVar98 = *(undefined1 (*) [32])(bspline_basis1 + lVar61 + 0xd8c);
    auVar92 = vmulps_avx512vl(local_4a0,auVar98);
    auVar93 = vmulps_avx512vl(local_4c0,auVar98);
    auVar92 = vfmadd231ps_avx512vl(auVar92,auVar99,local_480);
    auVar93 = vfmadd231ps_avx512vl(auVar93,auVar99,local_400);
    auVar92 = vfmadd231ps_avx512vl(auVar92,auVar89,local_540);
    auVar93 = vfmadd231ps_avx512vl(auVar93,auVar89,local_560);
    auVar71 = vfmadd231ps_fma(auVar92,auVar88,local_3e0);
    auVar72 = vfmadd231ps_fma(auVar93,auVar88,local_3c0);
    auVar92 = vsubps_avx512vl(ZEXT1632(auVar71),auVar90);
    auVar93 = vsubps_avx512vl(ZEXT1632(auVar72),auVar91);
    auVar94 = vmulps_avx512vl(auVar91,auVar92);
    auVar95 = vmulps_avx512vl(auVar90,auVar93);
    auVar94 = vsubps_avx512vl(auVar94,auVar95);
    auVar79 = vshufps_avx(local_4d0,local_4d0,0xff);
    uVar139 = auVar79._0_8_;
    local_80._8_8_ = uVar139;
    local_80._0_8_ = uVar139;
    local_80._16_8_ = uVar139;
    local_80._24_8_ = uVar139;
    auVar79 = vshufps_avx(local_4e0,local_4e0,0xff);
    local_a0 = vbroadcastsd_avx512vl(auVar79);
    auVar79 = vshufps_avx512vl(local_4f0,local_4f0,0xff);
    local_c0 = vbroadcastsd_avx512vl(auVar79);
    auVar79 = vshufps_avx512vl(_local_350,_local_350,0xff);
    uVar139 = auVar79._0_8_;
    register0x000012c8 = uVar139;
    local_e0 = uVar139;
    register0x000012d0 = uVar139;
    register0x000012d8 = uVar139;
    auVar95 = vmulps_avx512vl(_local_e0,auVar100);
    auVar95 = vfmadd231ps_avx512vl(auVar95,auVar101,local_c0);
    auVar95 = vfmadd231ps_avx512vl(auVar95,auVar103,local_a0);
    auVar95 = vfmadd231ps_avx512vl(auVar95,auVar102,local_80);
    auVar96 = vmulps_avx512vl(_local_e0,auVar98);
    auVar96 = vfmadd231ps_avx512vl(auVar96,auVar99,local_c0);
    auVar96 = vfmadd231ps_avx512vl(auVar96,auVar89,local_a0);
    auVar73 = vfmadd231ps_fma(auVar96,auVar88,local_80);
    auVar96 = vmulps_avx512vl(auVar93,auVar93);
    auVar96 = vfmadd231ps_avx512vl(auVar96,auVar92,auVar92);
    auVar97 = vmaxps_avx512vl(auVar95,ZEXT1632(auVar73));
    auVar97 = vmulps_avx512vl(auVar97,auVar97);
    auVar96 = vmulps_avx512vl(auVar97,auVar96);
    auVar94 = vmulps_avx512vl(auVar94,auVar94);
    uVar139 = vcmpps_avx512vl(auVar94,auVar96,2);
    auVar79 = vblendps_avx(auVar80,local_4d0,8);
    auVar74 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
    auVar84 = vandps_avx512vl(auVar79,auVar74);
    auVar79 = vblendps_avx(auVar16,local_4e0,8);
    auVar79 = vandps_avx512vl(auVar79,auVar74);
    auVar84 = vmaxps_avx(auVar84,auVar79);
    auVar79 = vblendps_avx(auVar81,local_4f0,8);
    auVar76 = vandps_avx512vl(auVar79,auVar74);
    auVar79 = vblendps_avx(auVar75,_local_350,8);
    auVar79 = vandps_avx512vl(auVar79,auVar74);
    auVar79 = vmaxps_avx(auVar76,auVar79);
    auVar79 = vmaxps_avx(auVar84,auVar79);
    auVar84 = vmovshdup_avx(auVar79);
    auVar84 = vmaxss_avx(auVar84,auVar79);
    auVar79 = vshufpd_avx(auVar79,auVar79,1);
    local_500 = vcvtsi2ss_avx512f(_local_350,iVar6);
    auVar79 = vmaxss_avx(auVar79,auVar84);
    fVar148 = local_500._0_4_;
    auVar96._4_4_ = fVar148;
    auVar96._0_4_ = fVar148;
    auVar96._8_4_ = fVar148;
    auVar96._12_4_ = fVar148;
    auVar96._16_4_ = fVar148;
    auVar96._20_4_ = fVar148;
    auVar96._24_4_ = fVar148;
    auVar96._28_4_ = fVar148;
    uVar19 = vcmpps_avx512vl(auVar96,_DAT_01f7b060,0xe);
    bVar62 = (byte)uVar139 & (byte)uVar19;
    auVar79 = vmulss_avx512f(auVar79,ZEXT416(0x35000000));
    auVar94._8_4_ = 2;
    auVar94._0_8_ = 0x200000002;
    auVar94._12_4_ = 2;
    auVar94._16_4_ = 2;
    auVar94._20_4_ = 2;
    auVar94._24_4_ = 2;
    auVar94._28_4_ = 2;
    local_100 = vpermps_avx512vl(auVar94,ZEXT1632(auVar80));
    local_120 = vpermps_avx512vl(auVar94,ZEXT1632(auVar16));
    local_140 = vpermps_avx512vl(auVar94,ZEXT1632(auVar81));
    local_460 = vpermps_avx2(auVar94,ZEXT1632(auVar75));
    local_360 = vpbroadcastd_avx512vl();
    uVar167 = *(uint *)(ray + k * 4 + 0x30);
    auVar84 = auVar98._0_16_;
    if (bVar62 == 0) {
      bVar57 = false;
      auVar84 = vxorps_avx512vl(auVar84,auVar84);
      auVar186 = ZEXT1664(auVar84);
      auVar102 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
      auVar187 = ZEXT3264(auVar102);
      auVar188 = ZEXT3264(local_3e0);
      auVar189 = ZEXT3264(local_3c0);
      auVar185 = ZEXT3264(local_540);
      auVar184 = ZEXT3264(local_560);
      auVar190 = ZEXT3264(local_480);
      auVar192 = ZEXT3264(local_400);
    }
    else {
      local_420._0_16_ = ZEXT416(uVar167);
      local_3a0._0_16_ = auVar79;
      auVar98 = vmulps_avx512vl(local_460,auVar98);
      auVar99 = vfmadd213ps_avx512vl(auVar99,local_140,auVar98);
      auVar89 = vfmadd213ps_avx512vl(auVar89,local_120,auVar99);
      auVar98 = vfmadd213ps_avx512vl(auVar88,local_100,auVar89);
      auVar100 = vmulps_avx512vl(local_460,auVar100);
      auVar101 = vfmadd213ps_avx512vl(auVar101,local_140,auVar100);
      auVar89 = vfmadd213ps_avx512vl(auVar103,local_120,auVar101);
      auVar103 = *(undefined1 (*) [32])(bspline_basis0 + lVar61 + 0x1210);
      auVar101 = *(undefined1 (*) [32])(bspline_basis0 + lVar61 + 0x1694);
      auVar100 = *(undefined1 (*) [32])(bspline_basis0 + lVar61 + 0x1b18);
      auVar88 = *(undefined1 (*) [32])(bspline_basis0 + lVar61 + 0x1f9c);
      auVar94 = vfmadd213ps_avx512vl(auVar102,local_100,auVar89);
      auVar102 = vmulps_avx512vl(local_4a0,auVar88);
      auVar89 = vmulps_avx512vl(local_4c0,auVar88);
      auVar88 = vmulps_avx512vl(local_460,auVar88);
      auVar102 = vfmadd231ps_avx512vl(auVar102,auVar100,local_480);
      auVar81 = vfmadd231ps_fma(auVar89,auVar100,local_400);
      auVar100 = vfmadd231ps_avx512vl(auVar88,local_140,auVar100);
      auVar80 = vfmadd231ps_fma(auVar102,auVar101,local_540);
      auVar102 = vfmadd231ps_avx512vl(ZEXT1632(auVar81),auVar101,local_560);
      auVar88 = vfmadd231ps_avx512vl(auVar100,local_120,auVar101);
      auVar89 = vfmadd231ps_avx512vl(ZEXT1632(auVar80),auVar103,local_3e0);
      auVar99 = vfmadd231ps_avx512vl(auVar102,auVar103,local_3c0);
      auVar102 = *(undefined1 (*) [32])(bspline_basis1 + lVar61 + 0x1210);
      auVar101 = *(undefined1 (*) [32])(bspline_basis1 + lVar61 + 0x1b18);
      auVar100 = *(undefined1 (*) [32])(bspline_basis1 + lVar61 + 0x1f9c);
      auVar88 = vfmadd231ps_avx512vl(auVar88,local_100,auVar103);
      auVar103 = vmulps_avx512vl(local_4a0,auVar100);
      auVar96 = vmulps_avx512vl(local_4c0,auVar100);
      auVar100 = vmulps_avx512vl(local_460,auVar100);
      auVar194 = ZEXT1664(auVar79);
      auVar97 = vfmadd231ps_avx512vl(auVar103,auVar101,local_480);
      auVar81 = vfmadd231ps_fma(auVar96,auVar101,local_400);
      auVar192 = ZEXT3264(local_400);
      auVar101 = vfmadd231ps_avx512vl(auVar100,local_140,auVar101);
      auVar103 = *(undefined1 (*) [32])(bspline_basis1 + lVar61 + 0x1694);
      auVar100 = vfmadd231ps_avx512vl(auVar97,auVar103,local_540);
      auVar96 = vfmadd231ps_avx512vl(ZEXT1632(auVar81),auVar103,local_560);
      auVar103 = vfmadd231ps_avx512vl(auVar101,local_120,auVar103);
      auVar101 = vfmadd231ps_avx512vl(auVar100,auVar102,local_3e0);
      auVar100 = vfmadd231ps_avx512vl(auVar96,auVar102,local_3c0);
      auVar96 = vfmadd231ps_avx512vl(auVar103,local_100,auVar102);
      auVar182._8_4_ = 0x7fffffff;
      auVar182._0_8_ = 0x7fffffff7fffffff;
      auVar182._12_4_ = 0x7fffffff;
      auVar182._16_4_ = 0x7fffffff;
      auVar182._20_4_ = 0x7fffffff;
      auVar182._24_4_ = 0x7fffffff;
      auVar182._28_4_ = 0x7fffffff;
      auVar102 = vandps_avx(auVar89,auVar182);
      auVar103 = vandps_avx(auVar99,auVar182);
      auVar103 = vmaxps_avx(auVar102,auVar103);
      auVar102 = vandps_avx(auVar88,auVar182);
      auVar102 = vmaxps_avx(auVar103,auVar102);
      auVar88 = vbroadcastss_avx512vl(auVar79);
      uVar63 = vcmpps_avx512vl(auVar102,auVar88,1);
      bVar57 = (bool)((byte)uVar63 & 1);
      auVar97._0_4_ = (float)((uint)bVar57 * auVar92._0_4_ | (uint)!bVar57 * auVar89._0_4_);
      bVar57 = (bool)((byte)(uVar63 >> 1) & 1);
      auVar97._4_4_ = (float)((uint)bVar57 * auVar92._4_4_ | (uint)!bVar57 * auVar89._4_4_);
      bVar57 = (bool)((byte)(uVar63 >> 2) & 1);
      auVar97._8_4_ = (float)((uint)bVar57 * auVar92._8_4_ | (uint)!bVar57 * auVar89._8_4_);
      bVar57 = (bool)((byte)(uVar63 >> 3) & 1);
      auVar97._12_4_ = (float)((uint)bVar57 * auVar92._12_4_ | (uint)!bVar57 * auVar89._12_4_);
      bVar57 = (bool)((byte)(uVar63 >> 4) & 1);
      auVar97._16_4_ = (float)((uint)bVar57 * auVar92._16_4_ | (uint)!bVar57 * auVar89._16_4_);
      bVar57 = (bool)((byte)(uVar63 >> 5) & 1);
      auVar97._20_4_ = (float)((uint)bVar57 * auVar92._20_4_ | (uint)!bVar57 * auVar89._20_4_);
      bVar57 = (bool)((byte)(uVar63 >> 6) & 1);
      auVar97._24_4_ = (float)((uint)bVar57 * auVar92._24_4_ | (uint)!bVar57 * auVar89._24_4_);
      bVar57 = SUB81(uVar63 >> 7,0);
      auVar97._28_4_ = (uint)bVar57 * auVar92._28_4_ | (uint)!bVar57 * auVar89._28_4_;
      bVar57 = (bool)((byte)uVar63 & 1);
      auVar113._0_4_ = (float)((uint)bVar57 * auVar93._0_4_ | (uint)!bVar57 * auVar99._0_4_);
      bVar57 = (bool)((byte)(uVar63 >> 1) & 1);
      auVar113._4_4_ = (float)((uint)bVar57 * auVar93._4_4_ | (uint)!bVar57 * auVar99._4_4_);
      bVar57 = (bool)((byte)(uVar63 >> 2) & 1);
      auVar113._8_4_ = (float)((uint)bVar57 * auVar93._8_4_ | (uint)!bVar57 * auVar99._8_4_);
      bVar57 = (bool)((byte)(uVar63 >> 3) & 1);
      auVar113._12_4_ = (float)((uint)bVar57 * auVar93._12_4_ | (uint)!bVar57 * auVar99._12_4_);
      bVar57 = (bool)((byte)(uVar63 >> 4) & 1);
      auVar113._16_4_ = (float)((uint)bVar57 * auVar93._16_4_ | (uint)!bVar57 * auVar99._16_4_);
      bVar57 = (bool)((byte)(uVar63 >> 5) & 1);
      auVar113._20_4_ = (float)((uint)bVar57 * auVar93._20_4_ | (uint)!bVar57 * auVar99._20_4_);
      bVar57 = (bool)((byte)(uVar63 >> 6) & 1);
      auVar113._24_4_ = (float)((uint)bVar57 * auVar93._24_4_ | (uint)!bVar57 * auVar99._24_4_);
      bVar57 = SUB81(uVar63 >> 7,0);
      auVar113._28_4_ = (uint)bVar57 * auVar93._28_4_ | (uint)!bVar57 * auVar99._28_4_;
      auVar102 = vandps_avx(auVar182,auVar101);
      auVar103 = vandps_avx(auVar100,auVar182);
      auVar103 = vmaxps_avx(auVar102,auVar103);
      auVar102 = vandps_avx(auVar96,auVar182);
      auVar102 = vmaxps_avx(auVar103,auVar102);
      uVar63 = vcmpps_avx512vl(auVar102,auVar88,1);
      bVar57 = (bool)((byte)uVar63 & 1);
      auVar104._0_4_ = (float)((uint)bVar57 * auVar92._0_4_ | (uint)!bVar57 * auVar101._0_4_);
      bVar57 = (bool)((byte)(uVar63 >> 1) & 1);
      auVar104._4_4_ = (float)((uint)bVar57 * auVar92._4_4_ | (uint)!bVar57 * auVar101._4_4_);
      bVar57 = (bool)((byte)(uVar63 >> 2) & 1);
      auVar104._8_4_ = (float)((uint)bVar57 * auVar92._8_4_ | (uint)!bVar57 * auVar101._8_4_);
      bVar57 = (bool)((byte)(uVar63 >> 3) & 1);
      auVar104._12_4_ = (float)((uint)bVar57 * auVar92._12_4_ | (uint)!bVar57 * auVar101._12_4_);
      bVar57 = (bool)((byte)(uVar63 >> 4) & 1);
      auVar104._16_4_ = (float)((uint)bVar57 * auVar92._16_4_ | (uint)!bVar57 * auVar101._16_4_);
      bVar57 = (bool)((byte)(uVar63 >> 5) & 1);
      auVar104._20_4_ = (float)((uint)bVar57 * auVar92._20_4_ | (uint)!bVar57 * auVar101._20_4_);
      bVar57 = (bool)((byte)(uVar63 >> 6) & 1);
      auVar104._24_4_ = (float)((uint)bVar57 * auVar92._24_4_ | (uint)!bVar57 * auVar101._24_4_);
      bVar57 = SUB81(uVar63 >> 7,0);
      auVar104._28_4_ = (uint)bVar57 * auVar92._28_4_ | (uint)!bVar57 * auVar101._28_4_;
      bVar57 = (bool)((byte)uVar63 & 1);
      auVar105._0_4_ = (float)((uint)bVar57 * auVar93._0_4_ | (uint)!bVar57 * auVar100._0_4_);
      bVar57 = (bool)((byte)(uVar63 >> 1) & 1);
      auVar105._4_4_ = (float)((uint)bVar57 * auVar93._4_4_ | (uint)!bVar57 * auVar100._4_4_);
      bVar57 = (bool)((byte)(uVar63 >> 2) & 1);
      auVar105._8_4_ = (float)((uint)bVar57 * auVar93._8_4_ | (uint)!bVar57 * auVar100._8_4_);
      bVar57 = (bool)((byte)(uVar63 >> 3) & 1);
      auVar105._12_4_ = (float)((uint)bVar57 * auVar93._12_4_ | (uint)!bVar57 * auVar100._12_4_);
      bVar57 = (bool)((byte)(uVar63 >> 4) & 1);
      auVar105._16_4_ = (float)((uint)bVar57 * auVar93._16_4_ | (uint)!bVar57 * auVar100._16_4_);
      bVar57 = (bool)((byte)(uVar63 >> 5) & 1);
      auVar105._20_4_ = (float)((uint)bVar57 * auVar93._20_4_ | (uint)!bVar57 * auVar100._20_4_);
      bVar57 = (bool)((byte)(uVar63 >> 6) & 1);
      auVar105._24_4_ = (float)((uint)bVar57 * auVar93._24_4_ | (uint)!bVar57 * auVar100._24_4_);
      bVar57 = SUB81(uVar63 >> 7,0);
      auVar105._28_4_ = (uint)bVar57 * auVar93._28_4_ | (uint)!bVar57 * auVar100._28_4_;
      auVar85 = vxorps_avx512vl(auVar84,auVar84);
      auVar186 = ZEXT1664(auVar85);
      auVar102 = vfmadd213ps_avx512vl(auVar97,auVar97,ZEXT1632(auVar85));
      auVar84 = vfmadd231ps_fma(auVar102,auVar113,auVar113);
      auVar101 = vrsqrt14ps_avx512vl(ZEXT1632(auVar84));
      fVar166 = auVar101._0_4_;
      fVar169 = auVar101._4_4_;
      fVar170 = auVar101._8_4_;
      fVar162 = auVar101._12_4_;
      fVar161 = auVar101._16_4_;
      fVar164 = auVar101._20_4_;
      fVar64 = auVar101._24_4_;
      auVar102._4_4_ = fVar169 * fVar169 * fVar169 * auVar84._4_4_ * -0.5;
      auVar102._0_4_ = fVar166 * fVar166 * fVar166 * auVar84._0_4_ * -0.5;
      auVar102._8_4_ = fVar170 * fVar170 * fVar170 * auVar84._8_4_ * -0.5;
      auVar102._12_4_ = fVar162 * fVar162 * fVar162 * auVar84._12_4_ * -0.5;
      auVar102._16_4_ = fVar161 * fVar161 * fVar161 * -0.0;
      auVar102._20_4_ = fVar164 * fVar164 * fVar164 * -0.0;
      auVar102._24_4_ = fVar64 * fVar64 * fVar64 * -0.0;
      auVar102._28_4_ = 0;
      auVar88 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
      auVar102 = vfmadd231ps_avx512vl(auVar102,auVar88,auVar101);
      auVar103._4_4_ = auVar113._4_4_ * auVar102._4_4_;
      auVar103._0_4_ = auVar113._0_4_ * auVar102._0_4_;
      auVar103._8_4_ = auVar113._8_4_ * auVar102._8_4_;
      auVar103._12_4_ = auVar113._12_4_ * auVar102._12_4_;
      auVar103._16_4_ = auVar113._16_4_ * auVar102._16_4_;
      auVar103._20_4_ = auVar113._20_4_ * auVar102._20_4_;
      auVar103._24_4_ = auVar113._24_4_ * auVar102._24_4_;
      auVar103._28_4_ = auVar101._28_4_;
      auVar101._4_4_ = auVar102._4_4_ * -auVar97._4_4_;
      auVar101._0_4_ = auVar102._0_4_ * -auVar97._0_4_;
      auVar101._8_4_ = auVar102._8_4_ * -auVar97._8_4_;
      auVar101._12_4_ = auVar102._12_4_ * -auVar97._12_4_;
      auVar101._16_4_ = auVar102._16_4_ * -auVar97._16_4_;
      auVar101._20_4_ = auVar102._20_4_ * -auVar97._20_4_;
      auVar101._24_4_ = auVar102._24_4_ * -auVar97._24_4_;
      auVar101._28_4_ = auVar97._28_4_ ^ 0x80000000;
      auVar92 = vmulps_avx512vl(auVar102,ZEXT1632(auVar85));
      auVar93 = ZEXT1632(auVar85);
      auVar100 = vfmadd213ps_avx512vl(auVar104,auVar104,auVar93);
      auVar84 = vfmadd231ps_fma(auVar100,auVar105,auVar105);
      auVar99 = vrsqrt14ps_avx512vl(ZEXT1632(auVar84));
      fVar166 = auVar99._0_4_;
      fVar169 = auVar99._4_4_;
      fVar170 = auVar99._8_4_;
      fVar162 = auVar99._12_4_;
      fVar161 = auVar99._16_4_;
      fVar164 = auVar99._20_4_;
      fVar64 = auVar99._24_4_;
      auVar100._4_4_ = fVar169 * fVar169 * fVar169 * auVar84._4_4_ * -0.5;
      auVar100._0_4_ = fVar166 * fVar166 * fVar166 * auVar84._0_4_ * -0.5;
      auVar100._8_4_ = fVar170 * fVar170 * fVar170 * auVar84._8_4_ * -0.5;
      auVar100._12_4_ = fVar162 * fVar162 * fVar162 * auVar84._12_4_ * -0.5;
      auVar100._16_4_ = fVar161 * fVar161 * fVar161 * -0.0;
      auVar100._20_4_ = fVar164 * fVar164 * fVar164 * -0.0;
      auVar100._24_4_ = fVar64 * fVar64 * fVar64 * -0.0;
      auVar100._28_4_ = 0;
      auVar100 = vfmadd231ps_avx512vl(auVar100,auVar88,auVar99);
      auVar89._4_4_ = auVar105._4_4_ * auVar100._4_4_;
      auVar89._0_4_ = auVar105._0_4_ * auVar100._0_4_;
      auVar89._8_4_ = auVar105._8_4_ * auVar100._8_4_;
      auVar89._12_4_ = auVar105._12_4_ * auVar100._12_4_;
      auVar89._16_4_ = auVar105._16_4_ * auVar100._16_4_;
      auVar89._20_4_ = auVar105._20_4_ * auVar100._20_4_;
      auVar89._24_4_ = auVar105._24_4_ * auVar100._24_4_;
      auVar89._28_4_ = auVar99._28_4_;
      auVar99._4_4_ = -auVar104._4_4_ * auVar100._4_4_;
      auVar99._0_4_ = -auVar104._0_4_ * auVar100._0_4_;
      auVar99._8_4_ = -auVar104._8_4_ * auVar100._8_4_;
      auVar99._12_4_ = -auVar104._12_4_ * auVar100._12_4_;
      auVar99._16_4_ = -auVar104._16_4_ * auVar100._16_4_;
      auVar99._20_4_ = -auVar104._20_4_ * auVar100._20_4_;
      auVar99._24_4_ = -auVar104._24_4_ * auVar100._24_4_;
      auVar99._28_4_ = auVar102._28_4_;
      auVar102 = vmulps_avx512vl(auVar100,auVar93);
      auVar84 = vfmadd213ps_fma(auVar103,auVar95,auVar90);
      auVar81 = vfmadd213ps_fma(auVar101,auVar95,auVar91);
      auVar100 = vfmadd213ps_avx512vl(auVar92,auVar95,auVar94);
      auVar88 = vfmadd213ps_avx512vl(auVar89,ZEXT1632(auVar73),ZEXT1632(auVar71));
      auVar74 = vfnmadd213ps_fma(auVar103,auVar95,auVar90);
      auVar90 = ZEXT1632(auVar73);
      auVar80 = vfmadd213ps_fma(auVar99,auVar90,ZEXT1632(auVar72));
      auVar76 = vfnmadd213ps_fma(auVar101,auVar95,auVar91);
      auVar16 = vfmadd213ps_fma(auVar102,auVar90,auVar98);
      auVar103 = vfnmadd231ps_avx512vl(auVar94,auVar95,auVar92);
      auVar77 = vfnmadd213ps_fma(auVar89,auVar90,ZEXT1632(auVar71));
      auVar72 = vfnmadd213ps_fma(auVar99,auVar90,ZEXT1632(auVar72));
      auVar78 = vfnmadd231ps_fma(auVar98,ZEXT1632(auVar73),auVar102);
      auVar101 = vsubps_avx512vl(auVar88,ZEXT1632(auVar74));
      auVar102 = vsubps_avx(ZEXT1632(auVar80),ZEXT1632(auVar76));
      auVar89 = vsubps_avx512vl(ZEXT1632(auVar16),auVar103);
      auVar99 = vmulps_avx512vl(auVar102,auVar103);
      auVar75 = vfmsub231ps_fma(auVar99,ZEXT1632(auVar76),auVar89);
      auVar98._4_4_ = auVar74._4_4_ * auVar89._4_4_;
      auVar98._0_4_ = auVar74._0_4_ * auVar89._0_4_;
      auVar98._8_4_ = auVar74._8_4_ * auVar89._8_4_;
      auVar98._12_4_ = auVar74._12_4_ * auVar89._12_4_;
      auVar98._16_4_ = auVar89._16_4_ * 0.0;
      auVar98._20_4_ = auVar89._20_4_ * 0.0;
      auVar98._24_4_ = auVar89._24_4_ * 0.0;
      auVar98._28_4_ = auVar89._28_4_;
      auVar89 = vfmsub231ps_avx512vl(auVar98,auVar103,auVar101);
      auVar90._4_4_ = auVar76._4_4_ * auVar101._4_4_;
      auVar90._0_4_ = auVar76._0_4_ * auVar101._0_4_;
      auVar90._8_4_ = auVar76._8_4_ * auVar101._8_4_;
      auVar90._12_4_ = auVar76._12_4_ * auVar101._12_4_;
      auVar90._16_4_ = auVar101._16_4_ * 0.0;
      auVar90._20_4_ = auVar101._20_4_ * 0.0;
      auVar90._24_4_ = auVar101._24_4_ * 0.0;
      auVar90._28_4_ = auVar101._28_4_;
      auVar71 = vfmsub231ps_fma(auVar90,ZEXT1632(auVar74),auVar102);
      auVar102 = vfmadd231ps_avx512vl(ZEXT1632(auVar71),auVar93,auVar89);
      auVar102 = vfmadd231ps_avx512vl(auVar102,auVar93,ZEXT1632(auVar75));
      auVar94 = ZEXT1632(auVar85);
      uVar63 = vcmpps_avx512vl(auVar102,auVar94,2);
      bVar53 = (byte)uVar63;
      fVar64 = (float)((uint)(bVar53 & 1) * auVar84._0_4_ |
                      (uint)!(bool)(bVar53 & 1) * auVar77._0_4_);
      bVar57 = (bool)((byte)(uVar63 >> 1) & 1);
      fVar124 = (float)((uint)bVar57 * auVar84._4_4_ | (uint)!bVar57 * auVar77._4_4_);
      bVar57 = (bool)((byte)(uVar63 >> 2) & 1);
      fVar126 = (float)((uint)bVar57 * auVar84._8_4_ | (uint)!bVar57 * auVar77._8_4_);
      bVar57 = (bool)((byte)(uVar63 >> 3) & 1);
      fVar128 = (float)((uint)bVar57 * auVar84._12_4_ | (uint)!bVar57 * auVar77._12_4_);
      auVar99 = ZEXT1632(CONCAT412(fVar128,CONCAT48(fVar126,CONCAT44(fVar124,fVar64))));
      fVar65 = (float)((uint)(bVar53 & 1) * auVar81._0_4_ |
                      (uint)!(bool)(bVar53 & 1) * auVar72._0_4_);
      bVar57 = (bool)((byte)(uVar63 >> 1) & 1);
      fVar125 = (float)((uint)bVar57 * auVar81._4_4_ | (uint)!bVar57 * auVar72._4_4_);
      bVar57 = (bool)((byte)(uVar63 >> 2) & 1);
      fVar127 = (float)((uint)bVar57 * auVar81._8_4_ | (uint)!bVar57 * auVar72._8_4_);
      bVar57 = (bool)((byte)(uVar63 >> 3) & 1);
      fVar129 = (float)((uint)bVar57 * auVar81._12_4_ | (uint)!bVar57 * auVar72._12_4_);
      auVar98 = ZEXT1632(CONCAT412(fVar129,CONCAT48(fVar127,CONCAT44(fVar125,fVar65))));
      auVar106._0_4_ =
           (float)((uint)(bVar53 & 1) * auVar100._0_4_ | (uint)!(bool)(bVar53 & 1) * auVar78._0_4_);
      bVar57 = (bool)((byte)(uVar63 >> 1) & 1);
      auVar106._4_4_ = (float)((uint)bVar57 * auVar100._4_4_ | (uint)!bVar57 * auVar78._4_4_);
      bVar57 = (bool)((byte)(uVar63 >> 2) & 1);
      auVar106._8_4_ = (float)((uint)bVar57 * auVar100._8_4_ | (uint)!bVar57 * auVar78._8_4_);
      bVar57 = (bool)((byte)(uVar63 >> 3) & 1);
      auVar106._12_4_ = (float)((uint)bVar57 * auVar100._12_4_ | (uint)!bVar57 * auVar78._12_4_);
      fVar169 = (float)((uint)((byte)(uVar63 >> 4) & 1) * auVar100._16_4_);
      auVar106._16_4_ = fVar169;
      fVar166 = (float)((uint)((byte)(uVar63 >> 5) & 1) * auVar100._20_4_);
      auVar106._20_4_ = fVar166;
      fVar170 = (float)((uint)((byte)(uVar63 >> 6) & 1) * auVar100._24_4_);
      auVar106._24_4_ = fVar170;
      iVar1 = (uint)(byte)(uVar63 >> 7) * auVar100._28_4_;
      auVar106._28_4_ = iVar1;
      auVar101 = vblendmps_avx512vl(ZEXT1632(auVar74),auVar88);
      auVar107._0_4_ =
           (uint)(bVar53 & 1) * auVar101._0_4_ | (uint)!(bool)(bVar53 & 1) * auVar81._0_4_;
      bVar57 = (bool)((byte)(uVar63 >> 1) & 1);
      auVar107._4_4_ = (uint)bVar57 * auVar101._4_4_ | (uint)!bVar57 * auVar81._4_4_;
      bVar57 = (bool)((byte)(uVar63 >> 2) & 1);
      auVar107._8_4_ = (uint)bVar57 * auVar101._8_4_ | (uint)!bVar57 * auVar81._8_4_;
      bVar57 = (bool)((byte)(uVar63 >> 3) & 1);
      auVar107._12_4_ = (uint)bVar57 * auVar101._12_4_ | (uint)!bVar57 * auVar81._12_4_;
      auVar107._16_4_ = (uint)((byte)(uVar63 >> 4) & 1) * auVar101._16_4_;
      auVar107._20_4_ = (uint)((byte)(uVar63 >> 5) & 1) * auVar101._20_4_;
      auVar107._24_4_ = (uint)((byte)(uVar63 >> 6) & 1) * auVar101._24_4_;
      auVar107._28_4_ = (uint)(byte)(uVar63 >> 7) * auVar101._28_4_;
      auVar101 = vblendmps_avx512vl(ZEXT1632(auVar76),ZEXT1632(auVar80));
      auVar108._0_4_ =
           (float)((uint)(bVar53 & 1) * auVar101._0_4_ | (uint)!(bool)(bVar53 & 1) * auVar75._0_4_);
      bVar57 = (bool)((byte)(uVar63 >> 1) & 1);
      auVar108._4_4_ = (float)((uint)bVar57 * auVar101._4_4_ | (uint)!bVar57 * auVar75._4_4_);
      bVar57 = (bool)((byte)(uVar63 >> 2) & 1);
      auVar108._8_4_ = (float)((uint)bVar57 * auVar101._8_4_ | (uint)!bVar57 * auVar75._8_4_);
      bVar57 = (bool)((byte)(uVar63 >> 3) & 1);
      auVar108._12_4_ = (float)((uint)bVar57 * auVar101._12_4_ | (uint)!bVar57 * auVar75._12_4_);
      fVar161 = (float)((uint)((byte)(uVar63 >> 4) & 1) * auVar101._16_4_);
      auVar108._16_4_ = fVar161;
      fVar164 = (float)((uint)((byte)(uVar63 >> 5) & 1) * auVar101._20_4_);
      auVar108._20_4_ = fVar164;
      fVar162 = (float)((uint)((byte)(uVar63 >> 6) & 1) * auVar101._24_4_);
      auVar108._24_4_ = fVar162;
      auVar108._28_4_ = (uint)(byte)(uVar63 >> 7) * auVar101._28_4_;
      auVar101 = vblendmps_avx512vl(auVar103,ZEXT1632(auVar16));
      auVar109._0_4_ =
           (float)((uint)(bVar53 & 1) * auVar101._0_4_ | (uint)!(bool)(bVar53 & 1) * auVar100._0_4_)
      ;
      bVar57 = (bool)((byte)(uVar63 >> 1) & 1);
      auVar109._4_4_ = (float)((uint)bVar57 * auVar101._4_4_ | (uint)!bVar57 * auVar100._4_4_);
      bVar57 = (bool)((byte)(uVar63 >> 2) & 1);
      auVar109._8_4_ = (float)((uint)bVar57 * auVar101._8_4_ | (uint)!bVar57 * auVar100._8_4_);
      bVar57 = (bool)((byte)(uVar63 >> 3) & 1);
      auVar109._12_4_ = (float)((uint)bVar57 * auVar101._12_4_ | (uint)!bVar57 * auVar100._12_4_);
      bVar57 = (bool)((byte)(uVar63 >> 4) & 1);
      auVar109._16_4_ = (float)((uint)bVar57 * auVar101._16_4_ | (uint)!bVar57 * auVar100._16_4_);
      bVar57 = (bool)((byte)(uVar63 >> 5) & 1);
      auVar109._20_4_ = (float)((uint)bVar57 * auVar101._20_4_ | (uint)!bVar57 * auVar100._20_4_);
      bVar57 = (bool)((byte)(uVar63 >> 6) & 1);
      auVar109._24_4_ = (float)((uint)bVar57 * auVar101._24_4_ | (uint)!bVar57 * auVar100._24_4_);
      bVar57 = SUB81(uVar63 >> 7,0);
      auVar109._28_4_ = (uint)bVar57 * auVar101._28_4_ | (uint)!bVar57 * auVar100._28_4_;
      auVar110._0_4_ =
           (uint)(bVar53 & 1) * (int)auVar74._0_4_ | (uint)!(bool)(bVar53 & 1) * auVar88._0_4_;
      bVar57 = (bool)((byte)(uVar63 >> 1) & 1);
      auVar110._4_4_ = (uint)bVar57 * (int)auVar74._4_4_ | (uint)!bVar57 * auVar88._4_4_;
      bVar57 = (bool)((byte)(uVar63 >> 2) & 1);
      auVar110._8_4_ = (uint)bVar57 * (int)auVar74._8_4_ | (uint)!bVar57 * auVar88._8_4_;
      bVar57 = (bool)((byte)(uVar63 >> 3) & 1);
      auVar110._12_4_ = (uint)bVar57 * (int)auVar74._12_4_ | (uint)!bVar57 * auVar88._12_4_;
      auVar110._16_4_ = (uint)!(bool)((byte)(uVar63 >> 4) & 1) * auVar88._16_4_;
      auVar110._20_4_ = (uint)!(bool)((byte)(uVar63 >> 5) & 1) * auVar88._20_4_;
      auVar110._24_4_ = (uint)!(bool)((byte)(uVar63 >> 6) & 1) * auVar88._24_4_;
      auVar110._28_4_ = (uint)!SUB81(uVar63 >> 7,0) * auVar88._28_4_;
      bVar57 = (bool)((byte)(uVar63 >> 1) & 1);
      bVar11 = (bool)((byte)(uVar63 >> 2) & 1);
      bVar13 = (bool)((byte)(uVar63 >> 3) & 1);
      auVar111._0_4_ =
           (uint)(bVar53 & 1) * auVar103._0_4_ | (uint)!(bool)(bVar53 & 1) * auVar16._0_4_;
      bVar10 = (bool)((byte)(uVar63 >> 1) & 1);
      auVar111._4_4_ = (uint)bVar10 * auVar103._4_4_ | (uint)!bVar10 * auVar16._4_4_;
      bVar10 = (bool)((byte)(uVar63 >> 2) & 1);
      auVar111._8_4_ = (uint)bVar10 * auVar103._8_4_ | (uint)!bVar10 * auVar16._8_4_;
      bVar10 = (bool)((byte)(uVar63 >> 3) & 1);
      auVar111._12_4_ = (uint)bVar10 * auVar103._12_4_ | (uint)!bVar10 * auVar16._12_4_;
      auVar111._16_4_ = (uint)((byte)(uVar63 >> 4) & 1) * auVar103._16_4_;
      auVar111._20_4_ = (uint)((byte)(uVar63 >> 5) & 1) * auVar103._20_4_;
      auVar111._24_4_ = (uint)((byte)(uVar63 >> 6) & 1) * auVar103._24_4_;
      iVar2 = (uint)(byte)(uVar63 >> 7) * auVar103._28_4_;
      auVar111._28_4_ = iVar2;
      auVar90 = vsubps_avx512vl(auVar110,auVar99);
      auVar103 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar13 * (int)auVar76._12_4_ |
                                               (uint)!bVar13 * auVar80._12_4_,
                                               CONCAT48((uint)bVar11 * (int)auVar76._8_4_ |
                                                        (uint)!bVar11 * auVar80._8_4_,
                                                        CONCAT44((uint)bVar57 * (int)auVar76._4_4_ |
                                                                 (uint)!bVar57 * auVar80._4_4_,
                                                                 (uint)(bVar53 & 1) *
                                                                 (int)auVar76._0_4_ |
                                                                 (uint)!(bool)(bVar53 & 1) *
                                                                 auVar80._0_4_)))),auVar98);
      auVar101 = vsubps_avx(auVar111,auVar106);
      auVar100 = vsubps_avx(auVar99,auVar107);
      auVar88 = vsubps_avx(auVar98,auVar108);
      auVar89 = vsubps_avx(auVar106,auVar109);
      auVar91._4_4_ = auVar101._4_4_ * fVar124;
      auVar91._0_4_ = auVar101._0_4_ * fVar64;
      auVar91._8_4_ = auVar101._8_4_ * fVar126;
      auVar91._12_4_ = auVar101._12_4_ * fVar128;
      auVar91._16_4_ = auVar101._16_4_ * 0.0;
      auVar91._20_4_ = auVar101._20_4_ * 0.0;
      auVar91._24_4_ = auVar101._24_4_ * 0.0;
      auVar91._28_4_ = iVar2;
      auVar84 = vfmsub231ps_fma(auVar91,auVar106,auVar90);
      auVar92._4_4_ = fVar125 * auVar90._4_4_;
      auVar92._0_4_ = fVar65 * auVar90._0_4_;
      auVar92._8_4_ = fVar127 * auVar90._8_4_;
      auVar92._12_4_ = fVar129 * auVar90._12_4_;
      auVar92._16_4_ = auVar90._16_4_ * 0.0;
      auVar92._20_4_ = auVar90._20_4_ * 0.0;
      auVar92._24_4_ = auVar90._24_4_ * 0.0;
      auVar92._28_4_ = auVar102._28_4_;
      auVar81 = vfmsub231ps_fma(auVar92,auVar99,auVar103);
      auVar102 = vfmadd231ps_avx512vl(ZEXT1632(auVar81),auVar94,ZEXT1632(auVar84));
      auVar157._0_4_ = auVar103._0_4_ * auVar106._0_4_;
      auVar157._4_4_ = auVar103._4_4_ * auVar106._4_4_;
      auVar157._8_4_ = auVar103._8_4_ * auVar106._8_4_;
      auVar157._12_4_ = auVar103._12_4_ * auVar106._12_4_;
      auVar157._16_4_ = auVar103._16_4_ * fVar169;
      auVar157._20_4_ = auVar103._20_4_ * fVar166;
      auVar157._24_4_ = auVar103._24_4_ * fVar170;
      auVar157._28_4_ = 0;
      auVar84 = vfmsub231ps_fma(auVar157,auVar98,auVar101);
      auVar91 = vfmadd231ps_avx512vl(auVar102,auVar94,ZEXT1632(auVar84));
      auVar102 = vmulps_avx512vl(auVar89,auVar107);
      auVar102 = vfmsub231ps_avx512vl(auVar102,auVar100,auVar109);
      auVar93._4_4_ = auVar88._4_4_ * auVar109._4_4_;
      auVar93._0_4_ = auVar88._0_4_ * auVar109._0_4_;
      auVar93._8_4_ = auVar88._8_4_ * auVar109._8_4_;
      auVar93._12_4_ = auVar88._12_4_ * auVar109._12_4_;
      auVar93._16_4_ = auVar88._16_4_ * auVar109._16_4_;
      auVar93._20_4_ = auVar88._20_4_ * auVar109._20_4_;
      auVar93._24_4_ = auVar88._24_4_ * auVar109._24_4_;
      auVar93._28_4_ = auVar109._28_4_;
      auVar84 = vfmsub231ps_fma(auVar93,auVar108,auVar89);
      auVar158._0_4_ = auVar108._0_4_ * auVar100._0_4_;
      auVar158._4_4_ = auVar108._4_4_ * auVar100._4_4_;
      auVar158._8_4_ = auVar108._8_4_ * auVar100._8_4_;
      auVar158._12_4_ = auVar108._12_4_ * auVar100._12_4_;
      auVar158._16_4_ = fVar161 * auVar100._16_4_;
      auVar158._20_4_ = fVar164 * auVar100._20_4_;
      auVar158._24_4_ = fVar162 * auVar100._24_4_;
      auVar158._28_4_ = 0;
      auVar81 = vfmsub231ps_fma(auVar158,auVar88,auVar107);
      auVar102 = vfmadd231ps_avx512vl(ZEXT1632(auVar81),auVar94,auVar102);
      auVar92 = vfmadd231ps_avx512vl(auVar102,auVar94,ZEXT1632(auVar84));
      auVar102 = vmaxps_avx(auVar91,auVar92);
      uVar139 = vcmpps_avx512vl(auVar102,auVar94,2);
      bVar62 = bVar62 & (byte)uVar139;
      auVar93 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
      auVar187 = ZEXT3264(auVar93);
      auVar188 = ZEXT3264(local_3e0);
      auVar189 = ZEXT3264(local_3c0);
      auVar185 = ZEXT3264(local_540);
      auVar184 = ZEXT3264(local_560);
      if (bVar62 == 0) {
        bVar57 = false;
        auVar190 = ZEXT3264(local_480);
        auVar191 = ZEXT3264(local_4a0);
        auVar193 = ZEXT3264(local_4c0);
      }
      else {
        auVar28._4_4_ = auVar89._4_4_ * auVar103._4_4_;
        auVar28._0_4_ = auVar89._0_4_ * auVar103._0_4_;
        auVar28._8_4_ = auVar89._8_4_ * auVar103._8_4_;
        auVar28._12_4_ = auVar89._12_4_ * auVar103._12_4_;
        auVar28._16_4_ = auVar89._16_4_ * auVar103._16_4_;
        auVar28._20_4_ = auVar89._20_4_ * auVar103._20_4_;
        auVar28._24_4_ = auVar89._24_4_ * auVar103._24_4_;
        auVar28._28_4_ = auVar102._28_4_;
        auVar80 = vfmsub231ps_fma(auVar28,auVar88,auVar101);
        auVar29._4_4_ = auVar101._4_4_ * auVar100._4_4_;
        auVar29._0_4_ = auVar101._0_4_ * auVar100._0_4_;
        auVar29._8_4_ = auVar101._8_4_ * auVar100._8_4_;
        auVar29._12_4_ = auVar101._12_4_ * auVar100._12_4_;
        auVar29._16_4_ = auVar101._16_4_ * auVar100._16_4_;
        auVar29._20_4_ = auVar101._20_4_ * auVar100._20_4_;
        auVar29._24_4_ = auVar101._24_4_ * auVar100._24_4_;
        auVar29._28_4_ = auVar101._28_4_;
        auVar81 = vfmsub231ps_fma(auVar29,auVar90,auVar89);
        auVar30._4_4_ = auVar88._4_4_ * auVar90._4_4_;
        auVar30._0_4_ = auVar88._0_4_ * auVar90._0_4_;
        auVar30._8_4_ = auVar88._8_4_ * auVar90._8_4_;
        auVar30._12_4_ = auVar88._12_4_ * auVar90._12_4_;
        auVar30._16_4_ = auVar88._16_4_ * auVar90._16_4_;
        auVar30._20_4_ = auVar88._20_4_ * auVar90._20_4_;
        auVar30._24_4_ = auVar88._24_4_ * auVar90._24_4_;
        auVar30._28_4_ = auVar88._28_4_;
        auVar16 = vfmsub231ps_fma(auVar30,auVar100,auVar103);
        auVar84 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar81),ZEXT1632(auVar16));
        auVar102 = vfmadd231ps_avx512vl(ZEXT1632(auVar84),ZEXT1632(auVar80),auVar94);
        auVar103 = vrcp14ps_avx512vl(auVar102);
        auVar101 = vfnmadd213ps_avx512vl(auVar103,auVar102,auVar93);
        auVar84 = vfmadd132ps_fma(auVar101,auVar103,auVar103);
        auVar31._4_4_ = auVar16._4_4_ * auVar106._4_4_;
        auVar31._0_4_ = auVar16._0_4_ * auVar106._0_4_;
        auVar31._8_4_ = auVar16._8_4_ * auVar106._8_4_;
        auVar31._12_4_ = auVar16._12_4_ * auVar106._12_4_;
        auVar31._16_4_ = fVar169 * 0.0;
        auVar31._20_4_ = fVar166 * 0.0;
        auVar31._24_4_ = fVar170 * 0.0;
        auVar31._28_4_ = iVar1;
        auVar81 = vfmadd231ps_fma(auVar31,auVar98,ZEXT1632(auVar81));
        auVar81 = vfmadd231ps_fma(ZEXT1632(auVar81),auVar99,ZEXT1632(auVar80));
        fVar166 = auVar84._0_4_;
        fVar169 = auVar84._4_4_;
        fVar170 = auVar84._8_4_;
        fVar162 = auVar84._12_4_;
        local_220 = ZEXT1632(CONCAT412(auVar81._12_4_ * fVar162,
                                       CONCAT48(auVar81._8_4_ * fVar170,
                                                CONCAT44(auVar81._4_4_ * fVar169,
                                                         auVar81._0_4_ * fVar166))));
        auVar165._4_4_ = uVar167;
        auVar165._0_4_ = uVar167;
        auVar165._8_4_ = uVar167;
        auVar165._12_4_ = uVar167;
        auVar165._16_4_ = uVar167;
        auVar165._20_4_ = uVar167;
        auVar165._24_4_ = uVar167;
        auVar165._28_4_ = uVar167;
        uVar139 = vcmpps_avx512vl(auVar165,local_220,2);
        uVar132 = *(undefined4 *)(ray + k * 4 + 0x80);
        auVar23._4_4_ = uVar132;
        auVar23._0_4_ = uVar132;
        auVar23._8_4_ = uVar132;
        auVar23._12_4_ = uVar132;
        auVar23._16_4_ = uVar132;
        auVar23._20_4_ = uVar132;
        auVar23._24_4_ = uVar132;
        auVar23._28_4_ = uVar132;
        uVar19 = vcmpps_avx512vl(local_220,auVar23,2);
        bVar62 = (byte)uVar139 & (byte)uVar19 & bVar62;
        auVar190 = ZEXT3264(local_480);
        auVar191 = ZEXT3264(local_4a0);
        auVar193 = ZEXT3264(local_4c0);
        if (bVar62 != 0) {
          uVar139 = vcmpps_avx512vl(auVar102,auVar94,4);
          bVar62 = bVar62 & (byte)uVar139;
          if (bVar62 != 0) {
            fVar161 = auVar91._0_4_ * fVar166;
            fVar164 = auVar91._4_4_ * fVar169;
            auVar32._4_4_ = fVar164;
            auVar32._0_4_ = fVar161;
            fVar64 = auVar91._8_4_ * fVar170;
            auVar32._8_4_ = fVar64;
            fVar65 = auVar91._12_4_ * fVar162;
            auVar32._12_4_ = fVar65;
            fVar124 = auVar91._16_4_ * 0.0;
            auVar32._16_4_ = fVar124;
            fVar125 = auVar91._20_4_ * 0.0;
            auVar32._20_4_ = fVar125;
            fVar126 = auVar91._24_4_ * 0.0;
            auVar32._24_4_ = fVar126;
            auVar32._28_4_ = auVar102._28_4_;
            auVar103 = vsubps_avx512vl(auVar93,auVar32);
            local_260._0_4_ =
                 (float)((uint)(bVar53 & 1) * (int)fVar161 |
                        (uint)!(bool)(bVar53 & 1) * auVar103._0_4_);
            bVar57 = (bool)((byte)(uVar63 >> 1) & 1);
            local_260._4_4_ = (float)((uint)bVar57 * (int)fVar164 | (uint)!bVar57 * auVar103._4_4_);
            bVar57 = (bool)((byte)(uVar63 >> 2) & 1);
            local_260._8_4_ = (float)((uint)bVar57 * (int)fVar64 | (uint)!bVar57 * auVar103._8_4_);
            bVar57 = (bool)((byte)(uVar63 >> 3) & 1);
            local_260._12_4_ = (float)((uint)bVar57 * (int)fVar65 | (uint)!bVar57 * auVar103._12_4_)
            ;
            bVar57 = (bool)((byte)(uVar63 >> 4) & 1);
            local_260._16_4_ =
                 (float)((uint)bVar57 * (int)fVar124 | (uint)!bVar57 * auVar103._16_4_);
            bVar57 = (bool)((byte)(uVar63 >> 5) & 1);
            local_260._20_4_ =
                 (float)((uint)bVar57 * (int)fVar125 | (uint)!bVar57 * auVar103._20_4_);
            bVar57 = (bool)((byte)(uVar63 >> 6) & 1);
            local_260._24_4_ =
                 (float)((uint)bVar57 * (int)fVar126 | (uint)!bVar57 * auVar103._24_4_);
            bVar57 = SUB81(uVar63 >> 7,0);
            local_260._28_4_ =
                 (float)((uint)bVar57 * auVar102._28_4_ | (uint)!bVar57 * auVar103._28_4_);
            auVar102 = vsubps_avx(ZEXT1632(auVar73),auVar95);
            auVar84 = vfmadd213ps_fma(auVar102,local_260,auVar95);
            uVar132 = *(undefined4 *)((long)local_5b0->ray_space + k * 4 + -0x10);
            auVar95._4_4_ = uVar132;
            auVar95._0_4_ = uVar132;
            auVar95._8_4_ = uVar132;
            auVar95._12_4_ = uVar132;
            auVar95._16_4_ = uVar132;
            auVar95._20_4_ = uVar132;
            auVar95._24_4_ = uVar132;
            auVar95._28_4_ = uVar132;
            auVar102 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar84._12_4_ + auVar84._12_4_,
                                                          CONCAT48(auVar84._8_4_ + auVar84._8_4_,
                                                                   CONCAT44(auVar84._4_4_ +
                                                                            auVar84._4_4_,
                                                                            auVar84._0_4_ +
                                                                            auVar84._0_4_)))),
                                       auVar95);
            uVar139 = vcmpps_avx512vl(local_220,auVar102,6);
            if (((byte)uVar139 & bVar62) != 0) {
              auVar149._0_4_ = auVar92._0_4_ * fVar166;
              auVar149._4_4_ = auVar92._4_4_ * fVar169;
              auVar149._8_4_ = auVar92._8_4_ * fVar170;
              auVar149._12_4_ = auVar92._12_4_ * fVar162;
              auVar149._16_4_ = auVar92._16_4_ * 0.0;
              auVar149._20_4_ = auVar92._20_4_ * 0.0;
              auVar149._24_4_ = auVar92._24_4_ * 0.0;
              auVar149._28_4_ = 0;
              auVar102 = vsubps_avx512vl(auVar93,auVar149);
              auVar112._0_4_ =
                   (uint)(bVar53 & 1) * (int)auVar149._0_4_ |
                   (uint)!(bool)(bVar53 & 1) * auVar102._0_4_;
              bVar57 = (bool)((byte)(uVar63 >> 1) & 1);
              auVar112._4_4_ = (uint)bVar57 * (int)auVar149._4_4_ | (uint)!bVar57 * auVar102._4_4_;
              bVar57 = (bool)((byte)(uVar63 >> 2) & 1);
              auVar112._8_4_ = (uint)bVar57 * (int)auVar149._8_4_ | (uint)!bVar57 * auVar102._8_4_;
              bVar57 = (bool)((byte)(uVar63 >> 3) & 1);
              auVar112._12_4_ =
                   (uint)bVar57 * (int)auVar149._12_4_ | (uint)!bVar57 * auVar102._12_4_;
              bVar57 = (bool)((byte)(uVar63 >> 4) & 1);
              auVar112._16_4_ =
                   (uint)bVar57 * (int)auVar149._16_4_ | (uint)!bVar57 * auVar102._16_4_;
              bVar57 = (bool)((byte)(uVar63 >> 5) & 1);
              auVar112._20_4_ =
                   (uint)bVar57 * (int)auVar149._20_4_ | (uint)!bVar57 * auVar102._20_4_;
              bVar57 = (bool)((byte)(uVar63 >> 6) & 1);
              auVar112._24_4_ =
                   (uint)bVar57 * (int)auVar149._24_4_ | (uint)!bVar57 * auVar102._24_4_;
              auVar112._28_4_ = (uint)!SUB81(uVar63 >> 7,0) * auVar102._28_4_;
              auVar24._8_4_ = 0x40000000;
              auVar24._0_8_ = 0x4000000040000000;
              auVar24._12_4_ = 0x40000000;
              auVar24._16_4_ = 0x40000000;
              auVar24._20_4_ = 0x40000000;
              auVar24._24_4_ = 0x40000000;
              auVar24._28_4_ = 0x40000000;
              local_240 = vfmsub132ps_avx512vl(auVar112,auVar93,auVar24);
              local_200 = 0;
              local_1f0 = local_4d0._0_8_;
              uStack_1e8 = local_4d0._8_8_;
              local_1e0 = local_4e0._0_8_;
              uStack_1d8 = local_4e0._8_8_;
              local_1d0 = local_4f0._0_8_;
              uStack_1c8 = local_4f0._8_8_;
              if ((pGVar59->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                if ((local_598->args->filter == (RTCFilterFunctionN)0x0) &&
                   (bVar57 = true, pGVar59->occlusionFilterN == (RTCFilterFunctionN)0x0))
                goto LAB_018e77e8;
                fVar148 = 1.0 / fVar148;
                local_1a0[0] = fVar148 * (local_260._0_4_ + 0.0);
                local_1a0[1] = fVar148 * (local_260._4_4_ + 1.0);
                local_1a0[2] = fVar148 * (local_260._8_4_ + 2.0);
                local_1a0[3] = fVar148 * (local_260._12_4_ + 3.0);
                fStack_190 = fVar148 * (local_260._16_4_ + 4.0);
                fStack_18c = fVar148 * (local_260._20_4_ + 5.0);
                fStack_188 = fVar148 * (local_260._24_4_ + 6.0);
                fStack_184 = local_260._28_4_ + 7.0;
                local_180 = local_240;
                local_160 = local_220;
                local_340 = 0;
                uVar58 = (ulong)((byte)uVar139 & bVar62);
                for (uVar63 = uVar58; (uVar63 & 1) == 0; uVar63 = uVar63 >> 1 | 0x8000000000000000)
                {
                  local_340 = local_340 + 1;
                }
                local_510 = vpbroadcastd_avx512vl();
                local_1fc = iVar6;
                while( true ) {
                  auVar79 = auVar194._0_16_;
                  auVar84 = auVar186._0_16_;
                  if (uVar58 == 0) break;
                  uVar132 = *(undefined4 *)(ray + k * 4 + 0x80);
                  fVar148 = local_1a0[local_340];
                  local_2d0._4_4_ = fVar148;
                  local_2d0._0_4_ = fVar148;
                  local_2d0._8_4_ = fVar148;
                  local_2d0._12_4_ = fVar148;
                  local_2c0 = *(undefined4 *)(local_180 + local_340 * 4);
                  *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_160 + local_340 * 4);
                  local_590.context = pRVar52->user;
                  fVar166 = 1.0 - fVar148;
                  auVar20._8_4_ = 0x80000000;
                  auVar20._0_8_ = 0x8000000080000000;
                  auVar20._12_4_ = 0x80000000;
                  auVar80 = vxorps_avx512vl(ZEXT416((uint)fVar166),auVar20);
                  auVar79 = ZEXT416((uint)(fVar148 * fVar166 * 4.0));
                  auVar81 = vfnmsub213ss_fma(local_2d0,local_2d0,auVar79);
                  auVar79 = vfmadd213ss_fma(ZEXT416((uint)fVar166),ZEXT416((uint)fVar166),auVar79);
                  fVar166 = fVar166 * auVar80._0_4_ * 0.5;
                  fVar169 = auVar81._0_4_ * 0.5;
                  fVar170 = auVar79._0_4_ * 0.5;
                  fVar148 = fVar148 * fVar148 * 0.5;
                  auVar153._0_4_ = fVar148 * (float)local_350._0_4_;
                  auVar153._4_4_ = fVar148 * (float)local_350._4_4_;
                  auVar153._8_4_ = fVar148 * fStack_348;
                  auVar153._12_4_ = fVar148 * fStack_344;
                  auVar135._4_4_ = fVar170;
                  auVar135._0_4_ = fVar170;
                  auVar135._8_4_ = fVar170;
                  auVar135._12_4_ = fVar170;
                  auVar79 = vfmadd132ps_fma(auVar135,auVar153,local_4f0);
                  auVar154._4_4_ = fVar169;
                  auVar154._0_4_ = fVar169;
                  auVar154._8_4_ = fVar169;
                  auVar154._12_4_ = fVar169;
                  auVar79 = vfmadd132ps_fma(auVar154,auVar79,local_4e0);
                  auVar136._4_4_ = fVar166;
                  auVar136._0_4_ = fVar166;
                  auVar136._8_4_ = fVar166;
                  auVar136._12_4_ = fVar166;
                  auVar79 = vfmadd132ps_fma(auVar136,auVar79,local_4d0);
                  uVar133 = auVar79._0_4_;
                  local_300._4_4_ = uVar133;
                  local_300._0_4_ = uVar133;
                  local_300._8_4_ = uVar133;
                  local_300._12_4_ = uVar133;
                  local_2f0 = vshufps_avx(auVar79,auVar79,0x55);
                  local_2e0 = vshufps_avx(auVar79,auVar79,0xaa);
                  local_2b0 = local_360._0_8_;
                  uStack_2a8 = local_360._8_8_;
                  local_2a0 = local_510;
                  vpcmpeqd_avx2(ZEXT1632(local_510),ZEXT1632(local_510));
                  uStack_28c = (local_590.context)->instID[0];
                  local_290 = uStack_28c;
                  uStack_288 = uStack_28c;
                  uStack_284 = uStack_28c;
                  uStack_280 = (local_590.context)->instPrimID[0];
                  uStack_27c = uStack_280;
                  uStack_278 = uStack_280;
                  uStack_274 = uStack_280;
                  local_5c0 = local_370;
                  local_590.valid = (int *)local_5c0;
                  local_590.geometryUserPtr = pGVar59->userPtr;
                  local_590.hit = local_300;
                  local_590.N = 4;
                  local_320 = (uint)uVar58;
                  uStack_31c = (uint)(uVar58 >> 0x20);
                  local_590.ray = (RTCRayN *)ray;
                  uStack_2bc = local_2c0;
                  uStack_2b8 = local_2c0;
                  uStack_2b4 = local_2c0;
                  if (pGVar59->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                    (*pGVar59->occlusionFilterN)(&local_590);
                    uVar58 = CONCAT44(uStack_31c,local_320);
                    auVar194 = ZEXT1664(local_3a0._0_16_);
                    auVar193 = ZEXT3264(local_4c0);
                    auVar191 = ZEXT3264(local_4a0);
                    auVar192 = ZEXT3264(local_400);
                    auVar190 = ZEXT3264(local_480);
                    auVar184 = ZEXT3264(local_560);
                    auVar185 = ZEXT3264(local_540);
                    auVar189 = ZEXT3264(local_3c0);
                    auVar188 = ZEXT3264(local_3e0);
                    auVar102 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                    auVar187 = ZEXT3264(auVar102);
                    auVar79 = vxorps_avx512vl(auVar84,auVar84);
                    auVar186 = ZEXT1664(auVar79);
                    uVar167 = local_420._0_4_;
                  }
                  auVar79 = auVar186._0_16_;
                  uVar63 = vptestmd_avx512vl(local_5c0,local_5c0);
                  if ((uVar63 & 0xf) != 0) {
                    p_Var9 = pRVar52->args->filter;
                    if ((p_Var9 != (RTCFilterFunctionN)0x0) &&
                       (((pRVar52->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar59->field_8).field_0x2 & 0x40) != 0)))) {
                      (*p_Var9)(&local_590);
                      uVar58 = CONCAT44(uStack_31c,local_320);
                      auVar194 = ZEXT1664(local_3a0._0_16_);
                      auVar193 = ZEXT3264(local_4c0);
                      auVar191 = ZEXT3264(local_4a0);
                      auVar192 = ZEXT3264(local_400);
                      auVar190 = ZEXT3264(local_480);
                      auVar184 = ZEXT3264(local_560);
                      auVar185 = ZEXT3264(local_540);
                      auVar189 = ZEXT3264(local_3c0);
                      auVar188 = ZEXT3264(local_3e0);
                      auVar102 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                      auVar187 = ZEXT3264(auVar102);
                      auVar79 = vxorps_avx512vl(auVar79,auVar79);
                      auVar186 = ZEXT1664(auVar79);
                      uVar167 = local_420._0_4_;
                    }
                    auVar79 = auVar194._0_16_;
                    auVar84 = *(undefined1 (*) [16])(local_590.ray + 0x80);
                    uVar63 = vptestmd_avx512vl(local_5c0,local_5c0);
                    uVar63 = uVar63 & 0xf;
                    auVar81 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                    bVar57 = (bool)((byte)uVar63 & 1);
                    auVar86._0_4_ = (uint)bVar57 * auVar81._0_4_ | (uint)!bVar57 * auVar84._0_4_;
                    bVar57 = (bool)((byte)(uVar63 >> 1) & 1);
                    auVar86._4_4_ = (uint)bVar57 * auVar81._4_4_ | (uint)!bVar57 * auVar84._4_4_;
                    bVar57 = (bool)((byte)(uVar63 >> 2) & 1);
                    auVar86._8_4_ = (uint)bVar57 * auVar81._8_4_ | (uint)!bVar57 * auVar84._8_4_;
                    bVar57 = SUB81(uVar63 >> 3,0);
                    auVar86._12_4_ = (uint)bVar57 * auVar81._12_4_ | (uint)!bVar57 * auVar84._12_4_;
                    *(undefined1 (*) [16])(local_590.ray + 0x80) = auVar86;
                    if ((byte)uVar63 != 0) {
                      bVar57 = true;
                      goto LAB_018e77e8;
                    }
                  }
                  *(undefined4 *)(ray + k * 4 + 0x80) = uVar132;
                  uVar63 = local_340 & 0x3f;
                  local_340 = 0;
                  uVar58 = uVar58 ^ 1L << uVar63;
                  for (uVar63 = uVar58; (uVar63 & 1) == 0; uVar63 = uVar63 >> 1 | 0x8000000000000000
                      ) {
                    local_340 = local_340 + 1;
                  }
                }
              }
            }
          }
        }
        bVar57 = false;
      }
    }
LAB_018e77e8:
    if (8 < iVar6) {
      local_3a0 = vpbroadcastd_avx512vl();
      local_420 = vbroadcastss_avx512vl(auVar79);
      fStack_338 = 1.0 / (float)local_500._0_4_;
      local_500 = vpbroadcastd_avx512vl();
      fStack_334 = fStack_338;
      fStack_330 = fStack_338;
      fStack_32c = fStack_338;
      fStack_328 = fStack_338;
      fStack_324 = fStack_338;
      local_320 = uVar167;
      uStack_31c = uVar167;
      uStack_318 = uVar167;
      uStack_314 = uVar167;
      uStack_310 = uVar167;
      uStack_30c = uVar167;
      uStack_308 = uVar167;
      uStack_304 = uVar167;
      local_340._0_4_ = fStack_338;
      local_340._4_4_ = fStack_338;
      for (lVar55 = 8; lVar55 < iVar6; lVar55 = lVar55 + 8) {
        auVar102 = vpbroadcastd_avx512vl();
        auVar88 = vpor_avx2(auVar102,_DAT_01fb4ba0);
        uVar19 = vpcmpd_avx512vl(auVar88,local_3a0,1);
        auVar102 = *(undefined1 (*) [32])(bspline_basis0 + lVar55 * 4 + lVar61);
        auVar103 = *(undefined1 (*) [32])(lVar61 + 0x21fffac + lVar55 * 4);
        auVar101 = *(undefined1 (*) [32])(lVar61 + 0x2200430 + lVar55 * 4);
        auVar100 = *(undefined1 (*) [32])(lVar61 + 0x22008b4 + lVar55 * 4);
        local_4a0 = auVar191._0_32_;
        auVar89 = vmulps_avx512vl(local_4a0,auVar100);
        local_4c0 = auVar193._0_32_;
        auVar99 = vmulps_avx512vl(local_4c0,auVar100);
        auVar33._4_4_ = auVar100._4_4_ * (float)local_e0._4_4_;
        auVar33._0_4_ = auVar100._0_4_ * (float)local_e0._0_4_;
        auVar33._8_4_ = auVar100._8_4_ * fStack_d8;
        auVar33._12_4_ = auVar100._12_4_ * fStack_d4;
        auVar33._16_4_ = auVar100._16_4_ * fStack_d0;
        auVar33._20_4_ = auVar100._20_4_ * fStack_cc;
        auVar33._24_4_ = auVar100._24_4_ * fStack_c8;
        auVar33._28_4_ = auVar88._28_4_;
        local_480 = auVar190._0_32_;
        auVar88 = vfmadd231ps_avx512vl(auVar89,auVar101,local_480);
        auVar107 = auVar192._0_32_;
        auVar89 = vfmadd231ps_avx512vl(auVar99,auVar101,auVar107);
        auVar99 = vfmadd231ps_avx512vl(auVar33,auVar101,local_c0);
        auVar105 = auVar185._0_32_;
        auVar88 = vfmadd231ps_avx512vl(auVar88,auVar103,auVar105);
        auVar104 = auVar184._0_32_;
        auVar89 = vfmadd231ps_avx512vl(auVar89,auVar103,auVar104);
        auVar79 = vfmadd231ps_fma(auVar99,auVar103,local_a0);
        auVar106 = auVar188._0_32_;
        auVar92 = vfmadd231ps_avx512vl(auVar88,auVar102,auVar106);
        local_3c0 = auVar189._0_32_;
        auVar93 = vfmadd231ps_avx512vl(auVar89,auVar102,local_3c0);
        auVar88 = *(undefined1 (*) [32])(bspline_basis1 + lVar55 * 4 + lVar61);
        auVar89 = *(undefined1 (*) [32])(lVar61 + 0x22023cc + lVar55 * 4);
        auVar79 = vfmadd231ps_fma(ZEXT1632(auVar79),auVar102,local_80);
        auVar99 = *(undefined1 (*) [32])(lVar61 + 0x2202850 + lVar55 * 4);
        auVar98 = *(undefined1 (*) [32])(lVar61 + 0x2202cd4 + lVar55 * 4);
        auVar90 = vmulps_avx512vl(local_4a0,auVar98);
        auVar91 = vmulps_avx512vl(local_4c0,auVar98);
        auVar34._4_4_ = auVar98._4_4_ * (float)local_e0._4_4_;
        auVar34._0_4_ = auVar98._0_4_ * (float)local_e0._0_4_;
        auVar34._8_4_ = auVar98._8_4_ * fStack_d8;
        auVar34._12_4_ = auVar98._12_4_ * fStack_d4;
        auVar34._16_4_ = auVar98._16_4_ * fStack_d0;
        auVar34._20_4_ = auVar98._20_4_ * fStack_cc;
        auVar34._24_4_ = auVar98._24_4_ * fStack_c8;
        auVar34._28_4_ = uStack_c4;
        auVar90 = vfmadd231ps_avx512vl(auVar90,auVar99,local_480);
        auVar91 = vfmadd231ps_avx512vl(auVar91,auVar99,auVar107);
        auVar94 = vfmadd231ps_avx512vl(auVar34,auVar99,local_c0);
        auVar90 = vfmadd231ps_avx512vl(auVar90,auVar89,auVar105);
        auVar91 = vfmadd231ps_avx512vl(auVar91,auVar89,auVar104);
        auVar84 = vfmadd231ps_fma(auVar94,auVar89,local_a0);
        auVar94 = vfmadd231ps_avx512vl(auVar90,auVar88,auVar106);
        auVar95 = vfmadd231ps_avx512vl(auVar91,auVar88,local_3c0);
        auVar84 = vfmadd231ps_fma(ZEXT1632(auVar84),auVar88,local_80);
        auVar96 = vmaxps_avx512vl(ZEXT1632(auVar79),ZEXT1632(auVar84));
        auVar90 = vsubps_avx(auVar94,auVar92);
        auVar91 = vsubps_avx(auVar95,auVar93);
        auVar97 = vmulps_avx512vl(auVar93,auVar90);
        auVar113 = vmulps_avx512vl(auVar92,auVar91);
        auVar97 = vsubps_avx512vl(auVar97,auVar113);
        auVar113 = vmulps_avx512vl(auVar91,auVar91);
        auVar113 = vfmadd231ps_avx512vl(auVar113,auVar90,auVar90);
        auVar96 = vmulps_avx512vl(auVar96,auVar96);
        auVar96 = vmulps_avx512vl(auVar96,auVar113);
        auVar97 = vmulps_avx512vl(auVar97,auVar97);
        uVar139 = vcmpps_avx512vl(auVar97,auVar96,2);
        bVar62 = (byte)uVar19 & (byte)uVar139;
        if (bVar62 == 0) {
          auVar185 = ZEXT3264(auVar105);
          auVar184 = ZEXT3264(auVar104);
        }
        else {
          auVar98 = vmulps_avx512vl(local_460,auVar98);
          auVar99 = vfmadd213ps_avx512vl(auVar99,local_140,auVar98);
          auVar89 = vfmadd213ps_avx512vl(auVar89,local_120,auVar99);
          auVar88 = vfmadd213ps_avx512vl(auVar88,local_100,auVar89);
          auVar100 = vmulps_avx512vl(local_460,auVar100);
          auVar101 = vfmadd213ps_avx512vl(auVar101,local_140,auVar100);
          auVar103 = vfmadd213ps_avx512vl(auVar103,local_120,auVar101);
          auVar89 = vfmadd213ps_avx512vl(auVar102,local_100,auVar103);
          auVar102 = *(undefined1 (*) [32])(lVar61 + 0x2200d38 + lVar55 * 4);
          auVar103 = *(undefined1 (*) [32])(lVar61 + 0x22011bc + lVar55 * 4);
          auVar101 = *(undefined1 (*) [32])(lVar61 + 0x2201640 + lVar55 * 4);
          auVar100 = *(undefined1 (*) [32])(lVar61 + 0x2201ac4 + lVar55 * 4);
          auVar99 = vmulps_avx512vl(local_4a0,auVar100);
          auVar98 = vmulps_avx512vl(local_4c0,auVar100);
          auVar100 = vmulps_avx512vl(local_460,auVar100);
          auVar99 = vfmadd231ps_avx512vl(auVar99,auVar101,local_480);
          auVar98 = vfmadd231ps_avx512vl(auVar98,auVar101,auVar107);
          auVar101 = vfmadd231ps_avx512vl(auVar100,local_140,auVar101);
          auVar100 = vfmadd231ps_avx512vl(auVar99,auVar103,auVar105);
          auVar99 = vfmadd231ps_avx512vl(auVar98,auVar103,auVar104);
          auVar103 = vfmadd231ps_avx512vl(auVar101,local_120,auVar103);
          auVar100 = vfmadd231ps_avx512vl(auVar100,auVar102,auVar106);
          auVar99 = vfmadd231ps_avx512vl(auVar99,auVar102,local_3c0);
          auVar98 = vfmadd231ps_avx512vl(auVar103,local_100,auVar102);
          auVar102 = *(undefined1 (*) [32])(lVar61 + 0x2203158 + lVar55 * 4);
          auVar103 = *(undefined1 (*) [32])(lVar61 + 0x2203a60 + lVar55 * 4);
          auVar101 = *(undefined1 (*) [32])(lVar61 + 0x2203ee4 + lVar55 * 4);
          auVar96 = vmulps_avx512vl(local_4a0,auVar101);
          auVar97 = vmulps_avx512vl(local_4c0,auVar101);
          auVar101 = vmulps_avx512vl(local_460,auVar101);
          auVar96 = vfmadd231ps_avx512vl(auVar96,auVar103,local_480);
          auVar97 = vfmadd231ps_avx512vl(auVar97,auVar103,auVar107);
          auVar101 = vfmadd231ps_avx512vl(auVar101,local_140,auVar103);
          auVar103 = *(undefined1 (*) [32])(lVar61 + 0x22035dc + lVar55 * 4);
          auVar96 = vfmadd231ps_avx512vl(auVar96,auVar103,auVar105);
          auVar97 = vfmadd231ps_avx512vl(auVar97,auVar103,auVar104);
          auVar103 = vfmadd231ps_avx512vl(auVar101,local_120,auVar103);
          auVar101 = vfmadd231ps_avx512vl(auVar96,auVar102,auVar106);
          auVar96 = vfmadd231ps_avx512vl(auVar97,auVar102,local_3c0);
          auVar103 = vfmadd231ps_avx512vl(auVar103,local_100,auVar102);
          auVar97 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
          vandps_avx512vl(auVar100,auVar97);
          vandps_avx512vl(auVar99,auVar97);
          auVar102 = vmaxps_avx(auVar97,auVar97);
          vandps_avx512vl(auVar98,auVar97);
          auVar102 = vmaxps_avx(auVar102,auVar97);
          uVar63 = vcmpps_avx512vl(auVar102,local_420,1);
          bVar10 = (bool)((byte)uVar63 & 1);
          auVar114._0_4_ = (float)((uint)bVar10 * auVar90._0_4_ | (uint)!bVar10 * auVar100._0_4_);
          bVar10 = (bool)((byte)(uVar63 >> 1) & 1);
          auVar114._4_4_ = (float)((uint)bVar10 * auVar90._4_4_ | (uint)!bVar10 * auVar100._4_4_);
          bVar10 = (bool)((byte)(uVar63 >> 2) & 1);
          auVar114._8_4_ = (float)((uint)bVar10 * auVar90._8_4_ | (uint)!bVar10 * auVar100._8_4_);
          bVar10 = (bool)((byte)(uVar63 >> 3) & 1);
          auVar114._12_4_ = (float)((uint)bVar10 * auVar90._12_4_ | (uint)!bVar10 * auVar100._12_4_)
          ;
          bVar10 = (bool)((byte)(uVar63 >> 4) & 1);
          auVar114._16_4_ = (float)((uint)bVar10 * auVar90._16_4_ | (uint)!bVar10 * auVar100._16_4_)
          ;
          bVar10 = (bool)((byte)(uVar63 >> 5) & 1);
          auVar114._20_4_ = (float)((uint)bVar10 * auVar90._20_4_ | (uint)!bVar10 * auVar100._20_4_)
          ;
          bVar10 = (bool)((byte)(uVar63 >> 6) & 1);
          auVar114._24_4_ = (float)((uint)bVar10 * auVar90._24_4_ | (uint)!bVar10 * auVar100._24_4_)
          ;
          bVar10 = SUB81(uVar63 >> 7,0);
          auVar114._28_4_ = (uint)bVar10 * auVar90._28_4_ | (uint)!bVar10 * auVar100._28_4_;
          bVar10 = (bool)((byte)uVar63 & 1);
          auVar115._0_4_ = (float)((uint)bVar10 * auVar91._0_4_ | (uint)!bVar10 * auVar99._0_4_);
          bVar10 = (bool)((byte)(uVar63 >> 1) & 1);
          auVar115._4_4_ = (float)((uint)bVar10 * auVar91._4_4_ | (uint)!bVar10 * auVar99._4_4_);
          bVar10 = (bool)((byte)(uVar63 >> 2) & 1);
          auVar115._8_4_ = (float)((uint)bVar10 * auVar91._8_4_ | (uint)!bVar10 * auVar99._8_4_);
          bVar10 = (bool)((byte)(uVar63 >> 3) & 1);
          auVar115._12_4_ = (float)((uint)bVar10 * auVar91._12_4_ | (uint)!bVar10 * auVar99._12_4_);
          bVar10 = (bool)((byte)(uVar63 >> 4) & 1);
          auVar115._16_4_ = (float)((uint)bVar10 * auVar91._16_4_ | (uint)!bVar10 * auVar99._16_4_);
          bVar10 = (bool)((byte)(uVar63 >> 5) & 1);
          auVar115._20_4_ = (float)((uint)bVar10 * auVar91._20_4_ | (uint)!bVar10 * auVar99._20_4_);
          bVar10 = (bool)((byte)(uVar63 >> 6) & 1);
          auVar115._24_4_ = (float)((uint)bVar10 * auVar91._24_4_ | (uint)!bVar10 * auVar99._24_4_);
          bVar10 = SUB81(uVar63 >> 7,0);
          auVar115._28_4_ = (uint)bVar10 * auVar91._28_4_ | (uint)!bVar10 * auVar99._28_4_;
          vandps_avx512vl(auVar101,auVar97);
          vandps_avx512vl(auVar96,auVar97);
          auVar102 = vmaxps_avx(auVar115,auVar115);
          vandps_avx512vl(auVar103,auVar97);
          auVar102 = vmaxps_avx(auVar102,auVar115);
          uVar63 = vcmpps_avx512vl(auVar102,local_420,1);
          bVar10 = (bool)((byte)uVar63 & 1);
          auVar116._0_4_ = (uint)bVar10 * auVar90._0_4_ | (uint)!bVar10 * auVar101._0_4_;
          bVar10 = (bool)((byte)(uVar63 >> 1) & 1);
          auVar116._4_4_ = (uint)bVar10 * auVar90._4_4_ | (uint)!bVar10 * auVar101._4_4_;
          bVar10 = (bool)((byte)(uVar63 >> 2) & 1);
          auVar116._8_4_ = (uint)bVar10 * auVar90._8_4_ | (uint)!bVar10 * auVar101._8_4_;
          bVar10 = (bool)((byte)(uVar63 >> 3) & 1);
          auVar116._12_4_ = (uint)bVar10 * auVar90._12_4_ | (uint)!bVar10 * auVar101._12_4_;
          bVar10 = (bool)((byte)(uVar63 >> 4) & 1);
          auVar116._16_4_ = (uint)bVar10 * auVar90._16_4_ | (uint)!bVar10 * auVar101._16_4_;
          bVar10 = (bool)((byte)(uVar63 >> 5) & 1);
          auVar116._20_4_ = (uint)bVar10 * auVar90._20_4_ | (uint)!bVar10 * auVar101._20_4_;
          bVar10 = (bool)((byte)(uVar63 >> 6) & 1);
          auVar116._24_4_ = (uint)bVar10 * auVar90._24_4_ | (uint)!bVar10 * auVar101._24_4_;
          bVar10 = SUB81(uVar63 >> 7,0);
          auVar116._28_4_ = (uint)bVar10 * auVar90._28_4_ | (uint)!bVar10 * auVar101._28_4_;
          bVar10 = (bool)((byte)uVar63 & 1);
          auVar117._0_4_ = (float)((uint)bVar10 * auVar91._0_4_ | (uint)!bVar10 * auVar96._0_4_);
          bVar10 = (bool)((byte)(uVar63 >> 1) & 1);
          auVar117._4_4_ = (float)((uint)bVar10 * auVar91._4_4_ | (uint)!bVar10 * auVar96._4_4_);
          bVar10 = (bool)((byte)(uVar63 >> 2) & 1);
          auVar117._8_4_ = (float)((uint)bVar10 * auVar91._8_4_ | (uint)!bVar10 * auVar96._8_4_);
          bVar10 = (bool)((byte)(uVar63 >> 3) & 1);
          auVar117._12_4_ = (float)((uint)bVar10 * auVar91._12_4_ | (uint)!bVar10 * auVar96._12_4_);
          bVar10 = (bool)((byte)(uVar63 >> 4) & 1);
          auVar117._16_4_ = (float)((uint)bVar10 * auVar91._16_4_ | (uint)!bVar10 * auVar96._16_4_);
          bVar10 = (bool)((byte)(uVar63 >> 5) & 1);
          auVar117._20_4_ = (float)((uint)bVar10 * auVar91._20_4_ | (uint)!bVar10 * auVar96._20_4_);
          bVar10 = (bool)((byte)(uVar63 >> 6) & 1);
          auVar117._24_4_ = (float)((uint)bVar10 * auVar91._24_4_ | (uint)!bVar10 * auVar96._24_4_);
          bVar10 = SUB81(uVar63 >> 7,0);
          auVar117._28_4_ = (uint)bVar10 * auVar91._28_4_ | (uint)!bVar10 * auVar96._28_4_;
          auVar172._8_4_ = 0x80000000;
          auVar172._0_8_ = 0x8000000080000000;
          auVar172._12_4_ = 0x80000000;
          auVar172._16_4_ = 0x80000000;
          auVar172._20_4_ = 0x80000000;
          auVar172._24_4_ = 0x80000000;
          auVar172._28_4_ = 0x80000000;
          auVar102 = vxorps_avx512vl(auVar116,auVar172);
          auVar96 = auVar186._0_32_;
          auVar103 = vfmadd213ps_avx512vl(auVar114,auVar114,auVar96);
          auVar81 = vfmadd231ps_fma(auVar103,auVar115,auVar115);
          auVar103 = vrsqrt14ps_avx512vl(ZEXT1632(auVar81));
          auVar183._8_4_ = 0xbf000000;
          auVar183._0_8_ = 0xbf000000bf000000;
          auVar183._12_4_ = 0xbf000000;
          auVar183._16_4_ = 0xbf000000;
          auVar183._20_4_ = 0xbf000000;
          auVar183._24_4_ = 0xbf000000;
          auVar183._28_4_ = 0xbf000000;
          fVar148 = auVar103._0_4_;
          fVar166 = auVar103._4_4_;
          fVar169 = auVar103._8_4_;
          fVar170 = auVar103._12_4_;
          fVar162 = auVar103._16_4_;
          fVar161 = auVar103._20_4_;
          fVar164 = auVar103._24_4_;
          auVar35._4_4_ = fVar166 * fVar166 * fVar166 * auVar81._4_4_ * -0.5;
          auVar35._0_4_ = fVar148 * fVar148 * fVar148 * auVar81._0_4_ * -0.5;
          auVar35._8_4_ = fVar169 * fVar169 * fVar169 * auVar81._8_4_ * -0.5;
          auVar35._12_4_ = fVar170 * fVar170 * fVar170 * auVar81._12_4_ * -0.5;
          auVar35._16_4_ = fVar162 * fVar162 * fVar162 * -0.0;
          auVar35._20_4_ = fVar161 * fVar161 * fVar161 * -0.0;
          auVar35._24_4_ = fVar164 * fVar164 * fVar164 * -0.0;
          auVar35._28_4_ = auVar115._28_4_;
          auVar101 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
          auVar103 = vfmadd231ps_avx512vl(auVar35,auVar101,auVar103);
          auVar36._4_4_ = auVar115._4_4_ * auVar103._4_4_;
          auVar36._0_4_ = auVar115._0_4_ * auVar103._0_4_;
          auVar36._8_4_ = auVar115._8_4_ * auVar103._8_4_;
          auVar36._12_4_ = auVar115._12_4_ * auVar103._12_4_;
          auVar36._16_4_ = auVar115._16_4_ * auVar103._16_4_;
          auVar36._20_4_ = auVar115._20_4_ * auVar103._20_4_;
          auVar36._24_4_ = auVar115._24_4_ * auVar103._24_4_;
          auVar36._28_4_ = 0;
          auVar37._4_4_ = auVar103._4_4_ * -auVar114._4_4_;
          auVar37._0_4_ = auVar103._0_4_ * -auVar114._0_4_;
          auVar37._8_4_ = auVar103._8_4_ * -auVar114._8_4_;
          auVar37._12_4_ = auVar103._12_4_ * -auVar114._12_4_;
          auVar37._16_4_ = auVar103._16_4_ * -auVar114._16_4_;
          auVar37._20_4_ = auVar103._20_4_ * -auVar114._20_4_;
          auVar37._24_4_ = auVar103._24_4_ * -auVar114._24_4_;
          auVar37._28_4_ = auVar115._28_4_;
          auVar100 = vmulps_avx512vl(auVar103,auVar96);
          auVar103 = vfmadd213ps_avx512vl(auVar116,auVar116,auVar96);
          auVar103 = vfmadd231ps_avx512vl(auVar103,auVar117,auVar117);
          auVar99 = vrsqrt14ps_avx512vl(auVar103);
          auVar103 = vmulps_avx512vl(auVar103,auVar183);
          fVar148 = auVar99._0_4_;
          fVar166 = auVar99._4_4_;
          fVar169 = auVar99._8_4_;
          fVar170 = auVar99._12_4_;
          fVar162 = auVar99._16_4_;
          fVar161 = auVar99._20_4_;
          fVar164 = auVar99._24_4_;
          auVar38._4_4_ = fVar166 * fVar166 * fVar166 * auVar103._4_4_;
          auVar38._0_4_ = fVar148 * fVar148 * fVar148 * auVar103._0_4_;
          auVar38._8_4_ = fVar169 * fVar169 * fVar169 * auVar103._8_4_;
          auVar38._12_4_ = fVar170 * fVar170 * fVar170 * auVar103._12_4_;
          auVar38._16_4_ = fVar162 * fVar162 * fVar162 * auVar103._16_4_;
          auVar38._20_4_ = fVar161 * fVar161 * fVar161 * auVar103._20_4_;
          auVar38._24_4_ = fVar164 * fVar164 * fVar164 * auVar103._24_4_;
          auVar38._28_4_ = auVar103._28_4_;
          auVar103 = vfmadd231ps_avx512vl(auVar38,auVar101,auVar99);
          auVar39._4_4_ = auVar117._4_4_ * auVar103._4_4_;
          auVar39._0_4_ = auVar117._0_4_ * auVar103._0_4_;
          auVar39._8_4_ = auVar117._8_4_ * auVar103._8_4_;
          auVar39._12_4_ = auVar117._12_4_ * auVar103._12_4_;
          auVar39._16_4_ = auVar117._16_4_ * auVar103._16_4_;
          auVar39._20_4_ = auVar117._20_4_ * auVar103._20_4_;
          auVar39._24_4_ = auVar117._24_4_ * auVar103._24_4_;
          auVar39._28_4_ = auVar99._28_4_;
          auVar40._4_4_ = auVar103._4_4_ * auVar102._4_4_;
          auVar40._0_4_ = auVar103._0_4_ * auVar102._0_4_;
          auVar40._8_4_ = auVar103._8_4_ * auVar102._8_4_;
          auVar40._12_4_ = auVar103._12_4_ * auVar102._12_4_;
          auVar40._16_4_ = auVar103._16_4_ * auVar102._16_4_;
          auVar40._20_4_ = auVar103._20_4_ * auVar102._20_4_;
          auVar40._24_4_ = auVar103._24_4_ * auVar102._24_4_;
          auVar40._28_4_ = auVar102._28_4_;
          auVar102 = vmulps_avx512vl(auVar103,auVar96);
          auVar81 = vfmadd213ps_fma(auVar36,ZEXT1632(auVar79),auVar92);
          auVar103 = ZEXT1632(auVar79);
          auVar80 = vfmadd213ps_fma(auVar37,auVar103,auVar93);
          auVar101 = vfmadd213ps_avx512vl(auVar100,auVar103,auVar89);
          auVar99 = vfmadd213ps_avx512vl(auVar39,ZEXT1632(auVar84),auVar94);
          auVar73 = vfnmadd213ps_fma(auVar36,auVar103,auVar92);
          auVar98 = ZEXT1632(auVar84);
          auVar16 = vfmadd213ps_fma(auVar40,auVar98,auVar95);
          auVar74 = vfnmadd213ps_fma(auVar37,auVar103,auVar93);
          auVar75 = vfmadd213ps_fma(auVar102,auVar98,auVar88);
          auVar93 = ZEXT1632(auVar79);
          auVar78 = vfnmadd231ps_fma(auVar89,auVar93,auVar100);
          auVar76 = vfnmadd213ps_fma(auVar39,auVar98,auVar94);
          auVar77 = vfnmadd213ps_fma(auVar40,auVar98,auVar95);
          auVar85 = vfnmadd231ps_fma(auVar88,ZEXT1632(auVar84),auVar102);
          auVar88 = vsubps_avx512vl(auVar99,ZEXT1632(auVar73));
          auVar102 = vsubps_avx(ZEXT1632(auVar16),ZEXT1632(auVar74));
          auVar103 = vsubps_avx(ZEXT1632(auVar75),ZEXT1632(auVar78));
          auVar41._4_4_ = auVar102._4_4_ * auVar78._4_4_;
          auVar41._0_4_ = auVar102._0_4_ * auVar78._0_4_;
          auVar41._8_4_ = auVar102._8_4_ * auVar78._8_4_;
          auVar41._12_4_ = auVar102._12_4_ * auVar78._12_4_;
          auVar41._16_4_ = auVar102._16_4_ * 0.0;
          auVar41._20_4_ = auVar102._20_4_ * 0.0;
          auVar41._24_4_ = auVar102._24_4_ * 0.0;
          auVar41._28_4_ = auVar100._28_4_;
          auVar79 = vfmsub231ps_fma(auVar41,ZEXT1632(auVar74),auVar103);
          auVar42._4_4_ = auVar103._4_4_ * auVar73._4_4_;
          auVar42._0_4_ = auVar103._0_4_ * auVar73._0_4_;
          auVar42._8_4_ = auVar103._8_4_ * auVar73._8_4_;
          auVar42._12_4_ = auVar103._12_4_ * auVar73._12_4_;
          auVar42._16_4_ = auVar103._16_4_ * 0.0;
          auVar42._20_4_ = auVar103._20_4_ * 0.0;
          auVar42._24_4_ = auVar103._24_4_ * 0.0;
          auVar42._28_4_ = auVar103._28_4_;
          auVar71 = vfmsub231ps_fma(auVar42,ZEXT1632(auVar78),auVar88);
          auVar43._4_4_ = auVar74._4_4_ * auVar88._4_4_;
          auVar43._0_4_ = auVar74._0_4_ * auVar88._0_4_;
          auVar43._8_4_ = auVar74._8_4_ * auVar88._8_4_;
          auVar43._12_4_ = auVar74._12_4_ * auVar88._12_4_;
          auVar43._16_4_ = auVar88._16_4_ * 0.0;
          auVar43._20_4_ = auVar88._20_4_ * 0.0;
          auVar43._24_4_ = auVar88._24_4_ * 0.0;
          auVar43._28_4_ = auVar88._28_4_;
          auVar72 = vfmsub231ps_fma(auVar43,ZEXT1632(auVar73),auVar102);
          auVar102 = vfmadd231ps_avx512vl(ZEXT1632(auVar72),auVar96,ZEXT1632(auVar71));
          auVar102 = vfmadd231ps_avx512vl(auVar102,auVar96,ZEXT1632(auVar79));
          uVar63 = vcmpps_avx512vl(auVar102,auVar96,2);
          bVar53 = (byte)uVar63;
          fVar124 = (float)((uint)(bVar53 & 1) * auVar81._0_4_ |
                           (uint)!(bool)(bVar53 & 1) * auVar76._0_4_);
          bVar10 = (bool)((byte)(uVar63 >> 1) & 1);
          fVar126 = (float)((uint)bVar10 * auVar81._4_4_ | (uint)!bVar10 * auVar76._4_4_);
          bVar10 = (bool)((byte)(uVar63 >> 2) & 1);
          fVar128 = (float)((uint)bVar10 * auVar81._8_4_ | (uint)!bVar10 * auVar76._8_4_);
          bVar10 = (bool)((byte)(uVar63 >> 3) & 1);
          fVar130 = (float)((uint)bVar10 * auVar81._12_4_ | (uint)!bVar10 * auVar76._12_4_);
          auVar98 = ZEXT1632(CONCAT412(fVar130,CONCAT48(fVar128,CONCAT44(fVar126,fVar124))));
          fVar125 = (float)((uint)(bVar53 & 1) * auVar80._0_4_ |
                           (uint)!(bool)(bVar53 & 1) * auVar77._0_4_);
          bVar10 = (bool)((byte)(uVar63 >> 1) & 1);
          fVar127 = (float)((uint)bVar10 * auVar80._4_4_ | (uint)!bVar10 * auVar77._4_4_);
          bVar10 = (bool)((byte)(uVar63 >> 2) & 1);
          fVar129 = (float)((uint)bVar10 * auVar80._8_4_ | (uint)!bVar10 * auVar77._8_4_);
          bVar10 = (bool)((byte)(uVar63 >> 3) & 1);
          fVar131 = (float)((uint)bVar10 * auVar80._12_4_ | (uint)!bVar10 * auVar77._12_4_);
          auVar90 = ZEXT1632(CONCAT412(fVar131,CONCAT48(fVar129,CONCAT44(fVar127,fVar125))));
          auVar118._0_4_ =
               (float)((uint)(bVar53 & 1) * auVar101._0_4_ |
                      (uint)!(bool)(bVar53 & 1) * auVar85._0_4_);
          bVar10 = (bool)((byte)(uVar63 >> 1) & 1);
          auVar118._4_4_ = (float)((uint)bVar10 * auVar101._4_4_ | (uint)!bVar10 * auVar85._4_4_);
          bVar10 = (bool)((byte)(uVar63 >> 2) & 1);
          auVar118._8_4_ = (float)((uint)bVar10 * auVar101._8_4_ | (uint)!bVar10 * auVar85._8_4_);
          bVar10 = (bool)((byte)(uVar63 >> 3) & 1);
          auVar118._12_4_ = (float)((uint)bVar10 * auVar101._12_4_ | (uint)!bVar10 * auVar85._12_4_)
          ;
          fVar169 = (float)((uint)((byte)(uVar63 >> 4) & 1) * auVar101._16_4_);
          auVar118._16_4_ = fVar169;
          fVar166 = (float)((uint)((byte)(uVar63 >> 5) & 1) * auVar101._20_4_);
          auVar118._20_4_ = fVar166;
          fVar148 = (float)((uint)((byte)(uVar63 >> 6) & 1) * auVar101._24_4_);
          auVar118._24_4_ = fVar148;
          iVar1 = (uint)(byte)(uVar63 >> 7) * auVar101._28_4_;
          auVar118._28_4_ = iVar1;
          auVar102 = vblendmps_avx512vl(ZEXT1632(auVar73),auVar99);
          auVar119._0_4_ =
               (uint)(bVar53 & 1) * auVar102._0_4_ | (uint)!(bool)(bVar53 & 1) * auVar79._0_4_;
          bVar10 = (bool)((byte)(uVar63 >> 1) & 1);
          auVar119._4_4_ = (uint)bVar10 * auVar102._4_4_ | (uint)!bVar10 * auVar79._4_4_;
          bVar10 = (bool)((byte)(uVar63 >> 2) & 1);
          auVar119._8_4_ = (uint)bVar10 * auVar102._8_4_ | (uint)!bVar10 * auVar79._8_4_;
          bVar10 = (bool)((byte)(uVar63 >> 3) & 1);
          auVar119._12_4_ = (uint)bVar10 * auVar102._12_4_ | (uint)!bVar10 * auVar79._12_4_;
          auVar119._16_4_ = (uint)((byte)(uVar63 >> 4) & 1) * auVar102._16_4_;
          auVar119._20_4_ = (uint)((byte)(uVar63 >> 5) & 1) * auVar102._20_4_;
          auVar119._24_4_ = (uint)((byte)(uVar63 >> 6) & 1) * auVar102._24_4_;
          auVar119._28_4_ = (uint)(byte)(uVar63 >> 7) * auVar102._28_4_;
          auVar102 = vblendmps_avx512vl(ZEXT1632(auVar74),ZEXT1632(auVar16));
          auVar120._0_4_ =
               (float)((uint)(bVar53 & 1) * auVar102._0_4_ |
                      (uint)!(bool)(bVar53 & 1) * auVar81._0_4_);
          bVar10 = (bool)((byte)(uVar63 >> 1) & 1);
          auVar120._4_4_ = (float)((uint)bVar10 * auVar102._4_4_ | (uint)!bVar10 * auVar81._4_4_);
          bVar10 = (bool)((byte)(uVar63 >> 2) & 1);
          auVar120._8_4_ = (float)((uint)bVar10 * auVar102._8_4_ | (uint)!bVar10 * auVar81._8_4_);
          bVar10 = (bool)((byte)(uVar63 >> 3) & 1);
          auVar120._12_4_ = (float)((uint)bVar10 * auVar102._12_4_ | (uint)!bVar10 * auVar81._12_4_)
          ;
          fVar161 = (float)((uint)((byte)(uVar63 >> 4) & 1) * auVar102._16_4_);
          auVar120._16_4_ = fVar161;
          fVar170 = (float)((uint)((byte)(uVar63 >> 5) & 1) * auVar102._20_4_);
          auVar120._20_4_ = fVar170;
          fVar162 = (float)((uint)((byte)(uVar63 >> 6) & 1) * auVar102._24_4_);
          auVar120._24_4_ = fVar162;
          auVar120._28_4_ = (uint)(byte)(uVar63 >> 7) * auVar102._28_4_;
          auVar102 = vblendmps_avx512vl(ZEXT1632(auVar78),ZEXT1632(auVar75));
          auVar121._0_4_ =
               (float)((uint)(bVar53 & 1) * auVar102._0_4_ |
                      (uint)!(bool)(bVar53 & 1) * auVar80._0_4_);
          bVar10 = (bool)((byte)(uVar63 >> 1) & 1);
          auVar121._4_4_ = (float)((uint)bVar10 * auVar102._4_4_ | (uint)!bVar10 * auVar80._4_4_);
          bVar10 = (bool)((byte)(uVar63 >> 2) & 1);
          auVar121._8_4_ = (float)((uint)bVar10 * auVar102._8_4_ | (uint)!bVar10 * auVar80._8_4_);
          bVar10 = (bool)((byte)(uVar63 >> 3) & 1);
          auVar121._12_4_ = (float)((uint)bVar10 * auVar102._12_4_ | (uint)!bVar10 * auVar80._12_4_)
          ;
          fVar164 = (float)((uint)((byte)(uVar63 >> 4) & 1) * auVar102._16_4_);
          auVar121._16_4_ = fVar164;
          fVar65 = (float)((uint)((byte)(uVar63 >> 5) & 1) * auVar102._20_4_);
          auVar121._20_4_ = fVar65;
          fVar64 = (float)((uint)((byte)(uVar63 >> 6) & 1) * auVar102._24_4_);
          auVar121._24_4_ = fVar64;
          iVar2 = (uint)(byte)(uVar63 >> 7) * auVar102._28_4_;
          auVar121._28_4_ = iVar2;
          auVar122._0_4_ =
               (uint)(bVar53 & 1) * (int)auVar73._0_4_ | (uint)!(bool)(bVar53 & 1) * auVar99._0_4_;
          bVar10 = (bool)((byte)(uVar63 >> 1) & 1);
          auVar122._4_4_ = (uint)bVar10 * (int)auVar73._4_4_ | (uint)!bVar10 * auVar99._4_4_;
          bVar10 = (bool)((byte)(uVar63 >> 2) & 1);
          auVar122._8_4_ = (uint)bVar10 * (int)auVar73._8_4_ | (uint)!bVar10 * auVar99._8_4_;
          bVar10 = (bool)((byte)(uVar63 >> 3) & 1);
          auVar122._12_4_ = (uint)bVar10 * (int)auVar73._12_4_ | (uint)!bVar10 * auVar99._12_4_;
          auVar122._16_4_ = (uint)!(bool)((byte)(uVar63 >> 4) & 1) * auVar99._16_4_;
          auVar122._20_4_ = (uint)!(bool)((byte)(uVar63 >> 5) & 1) * auVar99._20_4_;
          auVar122._24_4_ = (uint)!(bool)((byte)(uVar63 >> 6) & 1) * auVar99._24_4_;
          auVar122._28_4_ = (uint)!SUB81(uVar63 >> 7,0) * auVar99._28_4_;
          bVar10 = (bool)((byte)(uVar63 >> 1) & 1);
          bVar13 = (bool)((byte)(uVar63 >> 2) & 1);
          bVar14 = (bool)((byte)(uVar63 >> 3) & 1);
          bVar11 = (bool)((byte)(uVar63 >> 1) & 1);
          bVar12 = (bool)((byte)(uVar63 >> 2) & 1);
          bVar15 = (bool)((byte)(uVar63 >> 3) & 1);
          auVar99 = vsubps_avx512vl(auVar122,auVar98);
          auVar103 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar14 * (int)auVar74._12_4_ |
                                                   (uint)!bVar14 * auVar16._12_4_,
                                                   CONCAT48((uint)bVar13 * (int)auVar74._8_4_ |
                                                            (uint)!bVar13 * auVar16._8_4_,
                                                            CONCAT44((uint)bVar10 *
                                                                     (int)auVar74._4_4_ |
                                                                     (uint)!bVar10 * auVar16._4_4_,
                                                                     (uint)(bVar53 & 1) *
                                                                     (int)auVar74._0_4_ |
                                                                     (uint)!(bool)(bVar53 & 1) *
                                                                     auVar16._0_4_)))),auVar90);
          auVar101 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar15 * (int)auVar78._12_4_ |
                                                   (uint)!bVar15 * auVar75._12_4_,
                                                   CONCAT48((uint)bVar12 * (int)auVar78._8_4_ |
                                                            (uint)!bVar12 * auVar75._8_4_,
                                                            CONCAT44((uint)bVar11 *
                                                                     (int)auVar78._4_4_ |
                                                                     (uint)!bVar11 * auVar75._4_4_,
                                                                     (uint)(bVar53 & 1) *
                                                                     (int)auVar78._0_4_ |
                                                                     (uint)!(bool)(bVar53 & 1) *
                                                                     auVar75._0_4_)))),auVar118);
          auVar100 = vsubps_avx(auVar98,auVar119);
          auVar88 = vsubps_avx(auVar90,auVar120);
          auVar89 = vsubps_avx(auVar118,auVar121);
          auVar44._4_4_ = auVar101._4_4_ * fVar126;
          auVar44._0_4_ = auVar101._0_4_ * fVar124;
          auVar44._8_4_ = auVar101._8_4_ * fVar128;
          auVar44._12_4_ = auVar101._12_4_ * fVar130;
          auVar44._16_4_ = auVar101._16_4_ * 0.0;
          auVar44._20_4_ = auVar101._20_4_ * 0.0;
          auVar44._24_4_ = auVar101._24_4_ * 0.0;
          auVar44._28_4_ = 0;
          auVar79 = vfmsub231ps_fma(auVar44,auVar118,auVar99);
          auVar150._0_4_ = fVar125 * auVar99._0_4_;
          auVar150._4_4_ = fVar127 * auVar99._4_4_;
          auVar150._8_4_ = fVar129 * auVar99._8_4_;
          auVar150._12_4_ = fVar131 * auVar99._12_4_;
          auVar150._16_4_ = auVar99._16_4_ * 0.0;
          auVar150._20_4_ = auVar99._20_4_ * 0.0;
          auVar150._24_4_ = auVar99._24_4_ * 0.0;
          auVar150._28_4_ = 0;
          auVar81 = vfmsub231ps_fma(auVar150,auVar98,auVar103);
          auVar102 = vfmadd231ps_avx512vl(ZEXT1632(auVar81),auVar96,ZEXT1632(auVar79));
          auVar159._0_4_ = auVar103._0_4_ * auVar118._0_4_;
          auVar159._4_4_ = auVar103._4_4_ * auVar118._4_4_;
          auVar159._8_4_ = auVar103._8_4_ * auVar118._8_4_;
          auVar159._12_4_ = auVar103._12_4_ * auVar118._12_4_;
          auVar159._16_4_ = auVar103._16_4_ * fVar169;
          auVar159._20_4_ = auVar103._20_4_ * fVar166;
          auVar159._24_4_ = auVar103._24_4_ * fVar148;
          auVar159._28_4_ = 0;
          auVar79 = vfmsub231ps_fma(auVar159,auVar90,auVar101);
          auVar91 = vfmadd231ps_avx512vl(auVar102,auVar96,ZEXT1632(auVar79));
          auVar102 = vmulps_avx512vl(auVar89,auVar119);
          auVar102 = vfmsub231ps_avx512vl(auVar102,auVar100,auVar121);
          auVar45._4_4_ = auVar88._4_4_ * auVar121._4_4_;
          auVar45._0_4_ = auVar88._0_4_ * auVar121._0_4_;
          auVar45._8_4_ = auVar88._8_4_ * auVar121._8_4_;
          auVar45._12_4_ = auVar88._12_4_ * auVar121._12_4_;
          auVar45._16_4_ = auVar88._16_4_ * fVar164;
          auVar45._20_4_ = auVar88._20_4_ * fVar65;
          auVar45._24_4_ = auVar88._24_4_ * fVar64;
          auVar45._28_4_ = iVar2;
          auVar79 = vfmsub231ps_fma(auVar45,auVar120,auVar89);
          auVar160._0_4_ = auVar120._0_4_ * auVar100._0_4_;
          auVar160._4_4_ = auVar120._4_4_ * auVar100._4_4_;
          auVar160._8_4_ = auVar120._8_4_ * auVar100._8_4_;
          auVar160._12_4_ = auVar120._12_4_ * auVar100._12_4_;
          auVar160._16_4_ = fVar161 * auVar100._16_4_;
          auVar160._20_4_ = fVar170 * auVar100._20_4_;
          auVar160._24_4_ = fVar162 * auVar100._24_4_;
          auVar160._28_4_ = 0;
          auVar81 = vfmsub231ps_fma(auVar160,auVar88,auVar119);
          auVar102 = vfmadd231ps_avx512vl(ZEXT1632(auVar81),auVar96,auVar102);
          auVar92 = vfmadd231ps_avx512vl(auVar102,auVar96,ZEXT1632(auVar79));
          auVar102 = vmaxps_avx(auVar91,auVar92);
          uVar139 = vcmpps_avx512vl(auVar102,auVar96,2);
          bVar62 = bVar62 & (byte)uVar139;
          if (bVar62 != 0) {
            auVar46._4_4_ = auVar89._4_4_ * auVar103._4_4_;
            auVar46._0_4_ = auVar89._0_4_ * auVar103._0_4_;
            auVar46._8_4_ = auVar89._8_4_ * auVar103._8_4_;
            auVar46._12_4_ = auVar89._12_4_ * auVar103._12_4_;
            auVar46._16_4_ = auVar89._16_4_ * auVar103._16_4_;
            auVar46._20_4_ = auVar89._20_4_ * auVar103._20_4_;
            auVar46._24_4_ = auVar89._24_4_ * auVar103._24_4_;
            auVar46._28_4_ = auVar102._28_4_;
            auVar80 = vfmsub231ps_fma(auVar46,auVar88,auVar101);
            auVar47._4_4_ = auVar101._4_4_ * auVar100._4_4_;
            auVar47._0_4_ = auVar101._0_4_ * auVar100._0_4_;
            auVar47._8_4_ = auVar101._8_4_ * auVar100._8_4_;
            auVar47._12_4_ = auVar101._12_4_ * auVar100._12_4_;
            auVar47._16_4_ = auVar101._16_4_ * auVar100._16_4_;
            auVar47._20_4_ = auVar101._20_4_ * auVar100._20_4_;
            auVar47._24_4_ = auVar101._24_4_ * auVar100._24_4_;
            auVar47._28_4_ = auVar101._28_4_;
            auVar81 = vfmsub231ps_fma(auVar47,auVar99,auVar89);
            auVar48._4_4_ = auVar88._4_4_ * auVar99._4_4_;
            auVar48._0_4_ = auVar88._0_4_ * auVar99._0_4_;
            auVar48._8_4_ = auVar88._8_4_ * auVar99._8_4_;
            auVar48._12_4_ = auVar88._12_4_ * auVar99._12_4_;
            auVar48._16_4_ = auVar88._16_4_ * auVar99._16_4_;
            auVar48._20_4_ = auVar88._20_4_ * auVar99._20_4_;
            auVar48._24_4_ = auVar88._24_4_ * auVar99._24_4_;
            auVar48._28_4_ = auVar88._28_4_;
            auVar16 = vfmsub231ps_fma(auVar48,auVar100,auVar103);
            auVar79 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar81),ZEXT1632(auVar16));
            auVar102 = vfmadd231ps_avx512vl(ZEXT1632(auVar79),ZEXT1632(auVar80),auVar96);
            auVar103 = vrcp14ps_avx512vl(auVar102);
            auVar100 = auVar187._0_32_;
            auVar101 = vfnmadd213ps_avx512vl(auVar103,auVar102,auVar100);
            auVar79 = vfmadd132ps_fma(auVar101,auVar103,auVar103);
            auVar49._4_4_ = auVar16._4_4_ * auVar118._4_4_;
            auVar49._0_4_ = auVar16._0_4_ * auVar118._0_4_;
            auVar49._8_4_ = auVar16._8_4_ * auVar118._8_4_;
            auVar49._12_4_ = auVar16._12_4_ * auVar118._12_4_;
            auVar49._16_4_ = fVar169 * 0.0;
            auVar49._20_4_ = fVar166 * 0.0;
            auVar49._24_4_ = fVar148 * 0.0;
            auVar49._28_4_ = iVar1;
            auVar81 = vfmadd231ps_fma(auVar49,auVar90,ZEXT1632(auVar81));
            auVar81 = vfmadd231ps_fma(ZEXT1632(auVar81),auVar98,ZEXT1632(auVar80));
            fVar148 = auVar79._0_4_;
            fVar166 = auVar79._4_4_;
            fVar169 = auVar79._8_4_;
            fVar170 = auVar79._12_4_;
            local_220 = ZEXT1632(CONCAT412(auVar81._12_4_ * fVar170,
                                           CONCAT48(auVar81._8_4_ * fVar169,
                                                    CONCAT44(auVar81._4_4_ * fVar166,
                                                             auVar81._0_4_ * fVar148))));
            auVar51._4_4_ = uStack_31c;
            auVar51._0_4_ = local_320;
            auVar51._8_4_ = uStack_318;
            auVar51._12_4_ = uStack_314;
            auVar51._16_4_ = uStack_310;
            auVar51._20_4_ = uStack_30c;
            auVar51._24_4_ = uStack_308;
            auVar51._28_4_ = uStack_304;
            uVar139 = vcmpps_avx512vl(local_220,auVar51,0xd);
            uVar132 = *(undefined4 *)(ray + k * 4 + 0x80);
            auVar25._4_4_ = uVar132;
            auVar25._0_4_ = uVar132;
            auVar25._8_4_ = uVar132;
            auVar25._12_4_ = uVar132;
            auVar25._16_4_ = uVar132;
            auVar25._20_4_ = uVar132;
            auVar25._24_4_ = uVar132;
            auVar25._28_4_ = uVar132;
            uVar19 = vcmpps_avx512vl(local_220,auVar25,2);
            bVar62 = (byte)uVar139 & (byte)uVar19 & bVar62;
            if (bVar62 != 0) {
              uVar139 = vcmpps_avx512vl(auVar102,auVar96,4);
              bVar62 = bVar62 & (byte)uVar139;
              auVar185 = ZEXT3264(local_540);
              auVar184 = ZEXT3264(local_560);
              if (bVar62 != 0) {
                fVar162 = auVar91._0_4_ * fVar148;
                fVar161 = auVar91._4_4_ * fVar166;
                auVar50._4_4_ = fVar161;
                auVar50._0_4_ = fVar162;
                fVar164 = auVar91._8_4_ * fVar169;
                auVar50._8_4_ = fVar164;
                fVar64 = auVar91._12_4_ * fVar170;
                auVar50._12_4_ = fVar64;
                fVar65 = auVar91._16_4_ * 0.0;
                auVar50._16_4_ = fVar65;
                fVar124 = auVar91._20_4_ * 0.0;
                auVar50._20_4_ = fVar124;
                fVar125 = auVar91._24_4_ * 0.0;
                auVar50._24_4_ = fVar125;
                auVar50._28_4_ = auVar102._28_4_;
                auVar103 = vsubps_avx512vl(auVar100,auVar50);
                local_260._0_4_ =
                     (float)((uint)(bVar53 & 1) * (int)fVar162 |
                            (uint)!(bool)(bVar53 & 1) * auVar103._0_4_);
                bVar10 = (bool)((byte)(uVar63 >> 1) & 1);
                local_260._4_4_ =
                     (float)((uint)bVar10 * (int)fVar161 | (uint)!bVar10 * auVar103._4_4_);
                bVar10 = (bool)((byte)(uVar63 >> 2) & 1);
                local_260._8_4_ =
                     (float)((uint)bVar10 * (int)fVar164 | (uint)!bVar10 * auVar103._8_4_);
                bVar10 = (bool)((byte)(uVar63 >> 3) & 1);
                local_260._12_4_ =
                     (float)((uint)bVar10 * (int)fVar64 | (uint)!bVar10 * auVar103._12_4_);
                bVar10 = (bool)((byte)(uVar63 >> 4) & 1);
                local_260._16_4_ =
                     (float)((uint)bVar10 * (int)fVar65 | (uint)!bVar10 * auVar103._16_4_);
                bVar10 = (bool)((byte)(uVar63 >> 5) & 1);
                local_260._20_4_ =
                     (float)((uint)bVar10 * (int)fVar124 | (uint)!bVar10 * auVar103._20_4_);
                bVar10 = (bool)((byte)(uVar63 >> 6) & 1);
                local_260._24_4_ =
                     (float)((uint)bVar10 * (int)fVar125 | (uint)!bVar10 * auVar103._24_4_);
                bVar10 = SUB81(uVar63 >> 7,0);
                local_260._28_4_ =
                     (float)((uint)bVar10 * auVar102._28_4_ | (uint)!bVar10 * auVar103._28_4_);
                auVar102 = vsubps_avx(ZEXT1632(auVar84),auVar93);
                auVar79 = vfmadd213ps_fma(auVar102,local_260,auVar93);
                uVar132 = *(undefined4 *)((long)local_5b0->ray_space + k * 4 + -0x10);
                auVar26._4_4_ = uVar132;
                auVar26._0_4_ = uVar132;
                auVar26._8_4_ = uVar132;
                auVar26._12_4_ = uVar132;
                auVar26._16_4_ = uVar132;
                auVar26._20_4_ = uVar132;
                auVar26._24_4_ = uVar132;
                auVar26._28_4_ = uVar132;
                auVar102 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar79._12_4_ + auVar79._12_4_,
                                                              CONCAT48(auVar79._8_4_ + auVar79._8_4_
                                                                       ,CONCAT44(auVar79._4_4_ +
                                                                                 auVar79._4_4_,
                                                                                 auVar79._0_4_ +
                                                                                 auVar79._0_4_)))),
                                           auVar26);
                uVar139 = vcmpps_avx512vl(local_220,auVar102,6);
                if (((byte)uVar139 & bVar62) != 0) {
                  auVar143._0_4_ = auVar92._0_4_ * fVar148;
                  auVar143._4_4_ = auVar92._4_4_ * fVar166;
                  auVar143._8_4_ = auVar92._8_4_ * fVar169;
                  auVar143._12_4_ = auVar92._12_4_ * fVar170;
                  auVar143._16_4_ = auVar92._16_4_ * 0.0;
                  auVar143._20_4_ = auVar92._20_4_ * 0.0;
                  auVar143._24_4_ = auVar92._24_4_ * 0.0;
                  auVar143._28_4_ = 0;
                  auVar102 = vsubps_avx512vl(auVar100,auVar143);
                  auVar123._0_4_ =
                       (uint)(bVar53 & 1) * (int)auVar143._0_4_ |
                       (uint)!(bool)(bVar53 & 1) * auVar102._0_4_;
                  bVar10 = (bool)((byte)(uVar63 >> 1) & 1);
                  auVar123._4_4_ =
                       (uint)bVar10 * (int)auVar143._4_4_ | (uint)!bVar10 * auVar102._4_4_;
                  bVar10 = (bool)((byte)(uVar63 >> 2) & 1);
                  auVar123._8_4_ =
                       (uint)bVar10 * (int)auVar143._8_4_ | (uint)!bVar10 * auVar102._8_4_;
                  bVar10 = (bool)((byte)(uVar63 >> 3) & 1);
                  auVar123._12_4_ =
                       (uint)bVar10 * (int)auVar143._12_4_ | (uint)!bVar10 * auVar102._12_4_;
                  bVar10 = (bool)((byte)(uVar63 >> 4) & 1);
                  auVar123._16_4_ =
                       (uint)bVar10 * (int)auVar143._16_4_ | (uint)!bVar10 * auVar102._16_4_;
                  bVar10 = (bool)((byte)(uVar63 >> 5) & 1);
                  auVar123._20_4_ =
                       (uint)bVar10 * (int)auVar143._20_4_ | (uint)!bVar10 * auVar102._20_4_;
                  bVar10 = (bool)((byte)(uVar63 >> 6) & 1);
                  auVar123._24_4_ =
                       (uint)bVar10 * (int)auVar143._24_4_ | (uint)!bVar10 * auVar102._24_4_;
                  auVar123._28_4_ = (uint)!SUB81(uVar63 >> 7,0) * auVar102._28_4_;
                  auVar27._8_4_ = 0x40000000;
                  auVar27._0_8_ = 0x4000000040000000;
                  auVar27._12_4_ = 0x40000000;
                  auVar27._16_4_ = 0x40000000;
                  auVar27._20_4_ = 0x40000000;
                  auVar27._24_4_ = 0x40000000;
                  auVar27._28_4_ = 0x40000000;
                  local_240 = vfmsub132ps_avx512vl(auVar123,auVar100,auVar27);
                  local_200 = (undefined4)lVar55;
                  local_1f0 = local_4d0._0_8_;
                  uStack_1e8 = local_4d0._8_8_;
                  local_1e0 = local_4e0._0_8_;
                  uStack_1d8 = local_4e0._8_8_;
                  local_1d0 = local_4f0._0_8_;
                  uStack_1c8 = local_4f0._8_8_;
                  pGVar59 = (pRVar52->scene->geometries).items[local_5a8].ptr;
                  if ((pGVar59->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                    bVar53 = 0;
                  }
                  else if ((pRVar52->args->filter != (RTCFilterFunctionN)0x0) ||
                          (bVar53 = 1, pGVar59->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                    auVar79 = vcvtsi2ss_avx512f(auVar186._0_16_,local_200);
                    fVar148 = auVar79._0_4_;
                    local_1a0[0] = (fVar148 + local_260._0_4_ + 0.0) * (float)local_340;
                    local_1a0[1] = (fVar148 + local_260._4_4_ + 1.0) * local_340._4_4_;
                    local_1a0[2] = (fVar148 + local_260._8_4_ + 2.0) * fStack_338;
                    local_1a0[3] = (fVar148 + local_260._12_4_ + 3.0) * fStack_334;
                    fStack_190 = (fVar148 + local_260._16_4_ + 4.0) * fStack_330;
                    fStack_18c = (fVar148 + local_260._20_4_ + 5.0) * fStack_32c;
                    fStack_188 = (fVar148 + local_260._24_4_ + 6.0) * fStack_328;
                    fStack_184 = fVar148 + local_260._28_4_ + 7.0;
                    local_180 = local_240;
                    local_160 = local_220;
                    uVar63 = 0;
                    uVar54 = (ulong)((byte)uVar139 & bVar62);
                    for (uVar58 = uVar54; local_5a0 = pGVar59, local_1fc = iVar6, (uVar58 & 1) == 0;
                        uVar58 = uVar58 >> 1 | 0x8000000000000000) {
                      uVar63 = uVar63 + 1;
                    }
                    while (auVar79 = auVar186._0_16_, uVar54 != 0) {
                      uVar132 = *(undefined4 *)(ray + k * 4 + 0x80);
                      fVar148 = local_1a0[uVar63];
                      local_2d0._4_4_ = fVar148;
                      local_2d0._0_4_ = fVar148;
                      local_2d0._8_4_ = fVar148;
                      local_2d0._12_4_ = fVar148;
                      local_2c0 = *(undefined4 *)(local_180 + uVar63 * 4);
                      *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_160 + uVar63 * 4);
                      local_590.context = pRVar52->user;
                      fVar166 = 1.0 - fVar148;
                      auVar22._8_4_ = 0x80000000;
                      auVar22._0_8_ = 0x8000000080000000;
                      auVar22._12_4_ = 0x80000000;
                      auVar81 = vxorps_avx512vl(ZEXT416((uint)fVar166),auVar22);
                      auVar79 = ZEXT416((uint)(fVar148 * fVar166 * 4.0));
                      auVar84 = vfnmsub213ss_fma(local_2d0,local_2d0,auVar79);
                      auVar79 = vfmadd213ss_fma(ZEXT416((uint)fVar166),ZEXT416((uint)fVar166),
                                                auVar79);
                      fVar166 = fVar166 * auVar81._0_4_ * 0.5;
                      fVar169 = auVar84._0_4_ * 0.5;
                      fVar170 = auVar79._0_4_ * 0.5;
                      fVar148 = fVar148 * fVar148 * 0.5;
                      auVar155._0_4_ = fVar148 * (float)local_350._0_4_;
                      auVar155._4_4_ = fVar148 * (float)local_350._4_4_;
                      auVar155._8_4_ = fVar148 * fStack_348;
                      auVar155._12_4_ = fVar148 * fStack_344;
                      auVar137._4_4_ = fVar170;
                      auVar137._0_4_ = fVar170;
                      auVar137._8_4_ = fVar170;
                      auVar137._12_4_ = fVar170;
                      auVar79 = vfmadd132ps_fma(auVar137,auVar155,local_4f0);
                      auVar156._4_4_ = fVar169;
                      auVar156._0_4_ = fVar169;
                      auVar156._8_4_ = fVar169;
                      auVar156._12_4_ = fVar169;
                      auVar79 = vfmadd132ps_fma(auVar156,auVar79,local_4e0);
                      auVar138._4_4_ = fVar166;
                      auVar138._0_4_ = fVar166;
                      auVar138._8_4_ = fVar166;
                      auVar138._12_4_ = fVar166;
                      auVar79 = vfmadd132ps_fma(auVar138,auVar79,local_4d0);
                      uVar133 = auVar79._0_4_;
                      local_300._4_4_ = uVar133;
                      local_300._0_4_ = uVar133;
                      local_300._8_4_ = uVar133;
                      local_300._12_4_ = uVar133;
                      local_2f0 = vshufps_avx(auVar79,auVar79,0x55);
                      local_2e0 = vshufps_avx(auVar79,auVar79,0xaa);
                      local_2b0 = local_360._0_8_;
                      uStack_2a8 = local_360._8_8_;
                      local_2a0 = local_500;
                      vpcmpeqd_avx2(ZEXT1632(local_500),ZEXT1632(local_500));
                      uStack_28c = (local_590.context)->instID[0];
                      local_290 = uStack_28c;
                      uStack_288 = uStack_28c;
                      uStack_284 = uStack_28c;
                      uStack_280 = (local_590.context)->instPrimID[0];
                      uStack_27c = uStack_280;
                      uStack_278 = uStack_280;
                      uStack_274 = uStack_280;
                      local_5c0 = local_370;
                      local_590.valid = (int *)local_5c0;
                      local_590.geometryUserPtr = pGVar59->userPtr;
                      local_590.hit = local_300;
                      local_590.N = 4;
                      local_510._0_8_ = uVar63;
                      uVar58 = uVar63;
                      local_590.ray = (RTCRayN *)ray;
                      uStack_2bc = local_2c0;
                      uStack_2b8 = local_2c0;
                      uStack_2b4 = local_2c0;
                      if (pGVar59->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                        (*pGVar59->occlusionFilterN)(&local_590);
                        uVar58 = local_510._0_8_;
                        pGVar59 = local_5a0;
                      }
                      uVar63 = vptestmd_avx512vl(local_5c0,local_5c0);
                      if ((uVar63 & 0xf) != 0) {
                        p_Var9 = pRVar52->args->filter;
                        if ((p_Var9 != (RTCFilterFunctionN)0x0) &&
                           (((pRVar52->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                            (((pGVar59->field_8).field_0x2 & 0x40) != 0)))) {
                          (*p_Var9)(&local_590);
                          uVar58 = local_510._0_8_;
                          pGVar59 = local_5a0;
                        }
                        auVar79 = auVar186._0_16_;
                        auVar84 = *(undefined1 (*) [16])(local_590.ray + 0x80);
                        uVar63 = vptestmd_avx512vl(local_5c0,local_5c0);
                        uVar63 = uVar63 & 0xf;
                        auVar81 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                        bVar10 = (bool)((byte)uVar63 & 1);
                        auVar87._0_4_ = (uint)bVar10 * auVar81._0_4_ | (uint)!bVar10 * auVar84._0_4_
                        ;
                        bVar10 = (bool)((byte)(uVar63 >> 1) & 1);
                        auVar87._4_4_ = (uint)bVar10 * auVar81._4_4_ | (uint)!bVar10 * auVar84._4_4_
                        ;
                        bVar10 = (bool)((byte)(uVar63 >> 2) & 1);
                        auVar87._8_4_ = (uint)bVar10 * auVar81._8_4_ | (uint)!bVar10 * auVar84._8_4_
                        ;
                        bVar10 = SUB81(uVar63 >> 3,0);
                        auVar87._12_4_ =
                             (uint)bVar10 * auVar81._12_4_ | (uint)!bVar10 * auVar84._12_4_;
                        *(undefined1 (*) [16])(local_590.ray + 0x80) = auVar87;
                        if ((byte)uVar63 != 0) {
                          bVar53 = 1;
                          goto LAB_018e8244;
                        }
                      }
                      *(undefined4 *)(ray + k * 4 + 0x80) = uVar132;
                      uVar63 = 0;
                      uVar54 = uVar54 ^ 1L << (uVar58 & 0x3f);
                      for (uVar58 = uVar54; (uVar58 & 1) == 0;
                          uVar58 = uVar58 >> 1 | 0x8000000000000000) {
                        uVar63 = uVar63 + 1;
                      }
                    }
                    bVar53 = 0;
LAB_018e8244:
                    auVar79 = vxorps_avx512vl(auVar79,auVar79);
                    auVar186 = ZEXT1664(auVar79);
                    auVar102 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                    auVar187 = ZEXT3264(auVar102);
                    auVar188 = ZEXT3264(local_3e0);
                    auVar189 = ZEXT3264(local_3c0);
                    auVar185 = ZEXT3264(local_540);
                    auVar184 = ZEXT3264(local_560);
                    auVar190 = ZEXT3264(local_480);
                    auVar192 = ZEXT3264(local_400);
                    auVar191 = ZEXT3264(local_4a0);
                    auVar193 = ZEXT3264(local_4c0);
                  }
                  bVar57 = (bool)(bVar57 | bVar53);
                }
              }
              goto LAB_018e8223;
            }
          }
          auVar185 = ZEXT3264(local_540);
          auVar184 = ZEXT3264(local_560);
        }
LAB_018e8223:
      }
    }
    if (bVar57) break;
    uVar132 = *(undefined4 *)(ray + k * 4 + 0x80);
    auVar21._4_4_ = uVar132;
    auVar21._0_4_ = uVar132;
    auVar21._8_4_ = uVar132;
    auVar21._12_4_ = uVar132;
    uVar139 = vcmpps_avx512vl(local_270,auVar21,2);
    context = pRVar52;
  }
  return uVar60 != 0;
}

Assistant:

static __forceinline bool occluded_t(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID),ray.time()[k]);

          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID)))
            return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }